

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  Primitive *pPVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  Primitive PVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  __int_type_conflict _Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined3 uVar22;
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined6 uVar28;
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  byte bVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  int iVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  bool bVar62;
  uint uVar63;
  uint uVar64;
  int iVar65;
  uint uVar66;
  uint uVar67;
  short sVar68;
  float t1;
  undefined2 uVar98;
  float fVar69;
  float fVar99;
  float fVar100;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar101;
  float fVar120;
  float fVar121;
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  float fVar122;
  float fVar139;
  float fVar140;
  vfloat4 v;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar141;
  float fVar158;
  float fVar159;
  vfloat4 v_1;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  float fVar160;
  float fVar161;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar171;
  float fVar194;
  float fVar195;
  vfloat_impl<4> p00;
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar196;
  float fVar206;
  float fVar207;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar208;
  float fVar217;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar219;
  float fVar229;
  float fVar230;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar243;
  float fVar245;
  vfloat4 a;
  undefined1 auVar232 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar244;
  float fVar246;
  float fVar247;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar248;
  float fVar249;
  float fVar258;
  float fVar260;
  vfloat4 a_2;
  undefined1 auVar250 [16];
  undefined1 auVar253 [16];
  float fVar259;
  float fVar261;
  float fVar262;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  float fVar263;
  float fVar272;
  float fVar273;
  vfloat4 a_3;
  float fVar274;
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar282 [16];
  float fVar287;
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar293;
  float fVar294;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  float fVar315;
  float fVar316;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_54d;
  uint local_54c;
  float fStack_540;
  float fStack_53c;
  undefined8 local_538;
  undefined8 local_528;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  Primitive *local_3e8;
  long local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [16];
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  uint auStack_338 [4];
  RTCFilterFunctionNArguments local_328;
  uint local_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint local_2e8;
  uint uStack_2e4;
  uint uStack_2e0;
  uint uStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float afStack_108 [8];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined8 auStack_58 [5];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 uVar97;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar156 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  
  PVar10 = prim[1];
  uVar51 = (ulong)(byte)PVar10;
  lVar17 = uVar51 * 0x25;
  pPVar4 = prim + lVar17 + 6;
  fVar140 = *(float *)(pPVar4 + 0xc);
  fVar141 = (*(float *)(ray + k * 4) - *(float *)pPVar4) * fVar140;
  fVar158 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar4 + 4)) * fVar140;
  fVar159 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar4 + 8)) * fVar140;
  fVar122 = *(float *)(ray + k * 4 + 0x40) * fVar140;
  fVar139 = *(float *)(ray + k * 4 + 0x50) * fVar140;
  fVar140 = *(float *)(ray + k * 4 + 0x60) * fVar140;
  uVar11 = *(undefined4 *)(prim + uVar51 * 4 + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar236._8_4_ = 0;
  auVar236._0_8_ = uVar58;
  auVar236._12_2_ = uVar98;
  auVar236._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar124._12_4_ = auVar236._12_4_;
  auVar124._8_2_ = 0;
  auVar124._0_8_ = uVar58;
  auVar124._10_2_ = uVar98;
  auVar70._10_6_ = auVar124._10_6_;
  auVar70._8_2_ = uVar98;
  auVar70._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar29._4_8_ = auVar70._8_8_;
  auVar29._2_2_ = uVar98;
  auVar29._0_2_ = uVar98;
  fVar295 = (float)((int)sVar68 >> 8);
  fVar303 = (float)(auVar29._0_4_ >> 0x18);
  fVar307 = (float)(auVar70._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 5 + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar58;
  auVar104._12_2_ = uVar98;
  auVar104._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar58;
  auVar103._10_2_ = uVar98;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar98;
  auVar102._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar30._4_8_ = auVar102._8_8_;
  auVar30._2_2_ = uVar98;
  auVar30._0_2_ = uVar98;
  fVar160 = (float)((int)sVar68 >> 8);
  fVar164 = (float)(auVar30._0_4_ >> 0x18);
  fVar166 = (float)(auVar102._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 6 + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar58;
  auVar107._12_2_ = uVar98;
  auVar107._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar58;
  auVar106._10_2_ = uVar98;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar98;
  auVar105._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar31._4_8_ = auVar105._8_8_;
  auVar31._2_2_ = uVar98;
  auVar31._0_2_ = uVar98;
  fVar196 = (float)((int)sVar68 >> 8);
  fVar206 = (float)(auVar31._0_4_ >> 0x18);
  fVar207 = (float)(auVar105._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 0xf + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar58;
  auVar110._12_2_ = uVar98;
  auVar110._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar58;
  auVar109._10_2_ = uVar98;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar98;
  auVar108._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar32._4_8_ = auVar108._8_8_;
  auVar32._2_2_ = uVar98;
  auVar32._0_2_ = uVar98;
  fVar69 = (float)((int)sVar68 >> 8);
  fVar99 = (float)(auVar32._0_4_ >> 0x18);
  fVar100 = (float)(auVar108._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar58;
  auVar174._12_2_ = uVar98;
  auVar174._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar58;
  auVar173._10_2_ = uVar98;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar98;
  auVar172._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar33._4_8_ = auVar172._8_8_;
  auVar33._2_2_ = uVar98;
  auVar33._0_2_ = uVar98;
  fVar208 = (float)((int)sVar68 >> 8);
  fVar217 = (float)(auVar33._0_4_ >> 0x18);
  fVar218 = (float)(auVar172._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar51 + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar58;
  auVar177._12_2_ = uVar98;
  auVar177._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar58;
  auVar176._10_2_ = uVar98;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar98;
  auVar175._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar34._4_8_ = auVar175._8_8_;
  auVar34._2_2_ = uVar98;
  auVar34._0_2_ = uVar98;
  fVar231 = (float)((int)sVar68 >> 8);
  fVar243 = (float)(auVar34._0_4_ >> 0x18);
  fVar245 = (float)(auVar175._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 0x1a + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar180._8_4_ = 0;
  auVar180._0_8_ = uVar58;
  auVar180._12_2_ = uVar98;
  auVar180._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar179._12_4_ = auVar180._12_4_;
  auVar179._8_2_ = 0;
  auVar179._0_8_ = uVar58;
  auVar179._10_2_ = uVar98;
  auVar178._10_6_ = auVar179._10_6_;
  auVar178._8_2_ = uVar98;
  auVar178._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar35._4_8_ = auVar178._8_8_;
  auVar35._2_2_ = uVar98;
  auVar35._0_2_ = uVar98;
  fVar219 = (float)((int)sVar68 >> 8);
  fVar229 = (float)(auVar35._0_4_ >> 0x18);
  fVar230 = (float)(auVar178._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 0x1b + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar58;
  auVar183._12_2_ = uVar98;
  auVar183._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar58;
  auVar182._10_2_ = uVar98;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar98;
  auVar181._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar36._4_8_ = auVar181._8_8_;
  auVar36._2_2_ = uVar98;
  auVar36._0_2_ = uVar98;
  fVar248 = (float)((int)sVar68 >> 8);
  fVar258 = (float)(auVar36._0_4_ >> 0x18);
  fVar260 = (float)(auVar181._8_4_ >> 0x18);
  uVar11 = *(undefined4 *)(prim + uVar51 * 0x1c + 6);
  uVar97 = (undefined1)((uint)uVar11 >> 0x18);
  uVar98 = CONCAT11(uVar97,uVar97);
  uVar97 = (undefined1)((uint)uVar11 >> 0x10);
  uVar26 = CONCAT35(CONCAT21(uVar98,uVar97),CONCAT14(uVar97,uVar11));
  uVar97 = (undefined1)((uint)uVar11 >> 8);
  uVar28 = CONCAT51(CONCAT41((int)((ulong)uVar26 >> 0x20),uVar97),uVar97);
  sVar68 = CONCAT11((char)uVar11,(char)uVar11);
  uVar58 = CONCAT62(uVar28,sVar68);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar58;
  auVar186._12_2_ = uVar98;
  auVar186._14_2_ = uVar98;
  uVar98 = (undefined2)((ulong)uVar26 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar58;
  auVar185._10_2_ = uVar98;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar98;
  auVar184._0_8_ = uVar58;
  uVar98 = (undefined2)uVar28;
  auVar37._4_8_ = auVar184._8_8_;
  auVar37._2_2_ = uVar98;
  auVar37._0_2_ = uVar98;
  fVar101 = (float)((int)sVar68 >> 8);
  fVar120 = (float)(auVar37._0_4_ >> 0x18);
  fVar121 = (float)(auVar184._8_4_ >> 0x18);
  fVar275 = fVar122 * fVar295 + fVar139 * fVar160 + fVar140 * fVar196;
  fVar286 = fVar122 * fVar303 + fVar139 * fVar164 + fVar140 * fVar206;
  fVar289 = fVar122 * fVar307 + fVar139 * fVar166 + fVar140 * fVar207;
  fVar292 = fVar122 * (float)(auVar124._12_4_ >> 0x18) +
            fVar139 * (float)(auVar103._12_4_ >> 0x18) + fVar140 * (float)(auVar106._12_4_ >> 0x18);
  fVar263 = fVar122 * fVar69 + fVar139 * fVar208 + fVar140 * fVar231;
  fVar272 = fVar122 * fVar99 + fVar139 * fVar217 + fVar140 * fVar243;
  fVar273 = fVar122 * fVar100 + fVar139 * fVar218 + fVar140 * fVar245;
  fVar274 = fVar122 * (float)(auVar109._12_4_ >> 0x18) +
            fVar139 * (float)(auVar173._12_4_ >> 0x18) + fVar140 * (float)(auVar176._12_4_ >> 0x18);
  fVar171 = fVar122 * fVar219 + fVar139 * fVar248 + fVar140 * fVar101;
  fVar194 = fVar122 * fVar229 + fVar139 * fVar258 + fVar140 * fVar120;
  fVar195 = fVar122 * fVar230 + fVar139 * fVar260 + fVar140 * fVar121;
  fVar122 = fVar122 * (float)(auVar179._12_4_ >> 0x18) +
            fVar139 * (float)(auVar182._12_4_ >> 0x18) + fVar140 * (float)(auVar185._12_4_ >> 0x18);
  fVar296 = fVar295 * fVar141 + fVar160 * fVar158 + fVar196 * fVar159;
  fVar303 = fVar303 * fVar141 + fVar164 * fVar158 + fVar206 * fVar159;
  fVar307 = fVar307 * fVar141 + fVar166 * fVar158 + fVar207 * fVar159;
  fVar311 = (float)(auVar124._12_4_ >> 0x18) * fVar141 +
            (float)(auVar103._12_4_ >> 0x18) * fVar158 + (float)(auVar106._12_4_ >> 0x18) * fVar159;
  fVar231 = fVar69 * fVar141 + fVar208 * fVar158 + fVar231 * fVar159;
  fVar243 = fVar99 * fVar141 + fVar217 * fVar158 + fVar243 * fVar159;
  fVar245 = fVar100 * fVar141 + fVar218 * fVar158 + fVar245 * fVar159;
  fVar295 = (float)(auVar109._12_4_ >> 0x18) * fVar141 +
            (float)(auVar173._12_4_ >> 0x18) * fVar158 + (float)(auVar176._12_4_ >> 0x18) * fVar159;
  fVar219 = fVar141 * fVar219 + fVar158 * fVar248 + fVar159 * fVar101;
  fVar229 = fVar141 * fVar229 + fVar158 * fVar258 + fVar159 * fVar120;
  fVar230 = fVar141 * fVar230 + fVar158 * fVar260 + fVar159 * fVar121;
  fVar248 = fVar141 * (float)(auVar179._12_4_ >> 0x18) +
            fVar158 * (float)(auVar182._12_4_ >> 0x18) + fVar159 * (float)(auVar185._12_4_ >> 0x18);
  fVar140 = (float)DAT_01ff1d40;
  fVar69 = DAT_01ff1d40._4_4_;
  fVar99 = DAT_01ff1d40._8_4_;
  fVar100 = DAT_01ff1d40._12_4_;
  uVar63 = -(uint)(fVar140 <= ABS(fVar275));
  uVar64 = -(uint)(fVar69 <= ABS(fVar286));
  uVar66 = -(uint)(fVar99 <= ABS(fVar289));
  uVar67 = -(uint)(fVar100 <= ABS(fVar292));
  auVar278._0_4_ = (uint)fVar275 & uVar63;
  auVar278._4_4_ = (uint)fVar286 & uVar64;
  auVar278._8_4_ = (uint)fVar289 & uVar66;
  auVar278._12_4_ = (uint)fVar292 & uVar67;
  auVar142._0_4_ = ~uVar63 & (uint)fVar140;
  auVar142._4_4_ = ~uVar64 & (uint)fVar69;
  auVar142._8_4_ = ~uVar66 & (uint)fVar99;
  auVar142._12_4_ = ~uVar67 & (uint)fVar100;
  auVar142 = auVar142 | auVar278;
  uVar63 = -(uint)(fVar140 <= ABS(fVar263));
  uVar64 = -(uint)(fVar69 <= ABS(fVar272));
  uVar66 = -(uint)(fVar99 <= ABS(fVar273));
  uVar67 = -(uint)(fVar100 <= ABS(fVar274));
  auVar264._0_4_ = (uint)fVar263 & uVar63;
  auVar264._4_4_ = (uint)fVar272 & uVar64;
  auVar264._8_4_ = (uint)fVar273 & uVar66;
  auVar264._12_4_ = (uint)fVar274 & uVar67;
  auVar197._0_4_ = ~uVar63 & (uint)fVar140;
  auVar197._4_4_ = ~uVar64 & (uint)fVar69;
  auVar197._8_4_ = ~uVar66 & (uint)fVar99;
  auVar197._12_4_ = ~uVar67 & (uint)fVar100;
  auVar197 = auVar197 | auVar264;
  uVar63 = -(uint)(fVar140 <= ABS(fVar171));
  uVar64 = -(uint)(fVar69 <= ABS(fVar194));
  uVar66 = -(uint)(fVar99 <= ABS(fVar195));
  uVar67 = -(uint)(fVar100 <= ABS(fVar122));
  auVar187._0_4_ = (uint)fVar171 & uVar63;
  auVar187._4_4_ = (uint)fVar194 & uVar64;
  auVar187._8_4_ = (uint)fVar195 & uVar66;
  auVar187._12_4_ = (uint)fVar122 & uVar67;
  auVar209._0_4_ = ~uVar63 & (uint)fVar140;
  auVar209._4_4_ = ~uVar64 & (uint)fVar69;
  auVar209._8_4_ = ~uVar66 & (uint)fVar99;
  auVar209._12_4_ = ~uVar67 & (uint)fVar100;
  auVar209 = auVar209 | auVar187;
  auVar70 = rcpps(_DAT_01ff1d40,auVar142);
  fVar140 = auVar70._0_4_;
  fVar100 = auVar70._4_4_;
  fVar160 = auVar70._8_4_;
  fVar208 = auVar70._12_4_;
  fVar140 = (1.0 - auVar142._0_4_ * fVar140) * fVar140 + fVar140;
  fVar100 = (1.0 - auVar142._4_4_ * fVar100) * fVar100 + fVar100;
  fVar160 = (1.0 - auVar142._8_4_ * fVar160) * fVar160 + fVar160;
  fVar208 = (1.0 - auVar142._12_4_ * fVar208) * fVar208 + fVar208;
  auVar70 = rcpps(auVar70,auVar197);
  fVar69 = auVar70._0_4_;
  fVar101 = auVar70._4_4_;
  fVar164 = auVar70._8_4_;
  fVar217 = auVar70._12_4_;
  fVar69 = (1.0 - auVar197._0_4_ * fVar69) * fVar69 + fVar69;
  fVar101 = (1.0 - auVar197._4_4_ * fVar101) * fVar101 + fVar101;
  fVar164 = (1.0 - auVar197._8_4_ * fVar164) * fVar164 + fVar164;
  fVar217 = (1.0 - auVar197._12_4_ * fVar217) * fVar217 + fVar217;
  auVar70 = rcpps(auVar70,auVar209);
  fVar99 = auVar70._0_4_;
  fVar120 = auVar70._4_4_;
  fVar166 = auVar70._8_4_;
  fVar218 = auVar70._12_4_;
  fVar99 = (1.0 - auVar209._0_4_ * fVar99) * fVar99 + fVar99;
  fVar120 = (1.0 - auVar209._4_4_ * fVar120) * fVar120 + fVar120;
  fVar166 = (1.0 - auVar209._8_4_ * fVar166) * fVar166 + fVar166;
  fVar218 = (1.0 - auVar209._12_4_ * fVar218) * fVar218 + fVar218;
  fVar258 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar17 + 0x16)) *
            *(float *)(prim + lVar17 + 0x1a);
  uVar58 = *(ulong *)(prim + uVar51 * 7 + 6);
  uVar98 = (undefined2)(uVar58 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar58;
  auVar71._12_2_ = uVar98;
  auVar71._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar58 >> 0x20);
  auVar318._12_4_ = auVar71._12_4_;
  auVar318._8_2_ = 0;
  auVar318._0_8_ = uVar58;
  auVar318._10_2_ = uVar98;
  auVar126._10_6_ = auVar318._10_6_;
  auVar126._8_2_ = uVar98;
  auVar126._0_8_ = uVar58;
  uVar98 = (undefined2)(uVar58 >> 0x10);
  auVar38._4_8_ = auVar126._8_8_;
  auVar38._2_2_ = uVar98;
  auVar38._0_2_ = uVar98;
  fVar121 = (float)(auVar38._0_4_ >> 0x10);
  fVar171 = (float)(auVar126._8_4_ >> 0x10);
  uVar52 = *(ulong *)(prim + uVar51 * 0xb + 6);
  uVar98 = (undefined2)(uVar52 >> 0x30);
  auVar145._8_4_ = 0;
  auVar145._0_8_ = uVar52;
  auVar145._12_2_ = uVar98;
  auVar145._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar52 >> 0x20);
  auVar144._12_4_ = auVar145._12_4_;
  auVar144._8_2_ = 0;
  auVar144._0_8_ = uVar52;
  auVar144._10_2_ = uVar98;
  auVar143._10_6_ = auVar144._10_6_;
  auVar143._8_2_ = uVar98;
  auVar143._0_8_ = uVar52;
  uVar98 = (undefined2)(uVar52 >> 0x10);
  auVar39._4_8_ = auVar143._8_8_;
  auVar39._2_2_ = uVar98;
  auVar39._0_2_ = uVar98;
  uVar53 = *(ulong *)(prim + uVar51 * 9 + 6);
  uVar98 = (undefined2)(uVar53 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar53;
  auVar74._12_2_ = uVar98;
  auVar74._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar53 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar53;
  auVar73._10_2_ = uVar98;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar98;
  auVar72._0_8_ = uVar53;
  uVar98 = (undefined2)(uVar53 >> 0x10);
  auVar40._4_8_ = auVar72._8_8_;
  auVar40._2_2_ = uVar98;
  auVar40._0_2_ = uVar98;
  fVar122 = (float)(auVar40._0_4_ >> 0x10);
  fVar194 = (float)(auVar72._8_4_ >> 0x10);
  uVar54 = *(ulong *)(prim + uVar51 * 0xd + 6);
  uVar98 = (undefined2)(uVar54 >> 0x30);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar54;
  auVar212._12_2_ = uVar98;
  auVar212._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar54 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar54;
  auVar211._10_2_ = uVar98;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar98;
  auVar210._0_8_ = uVar54;
  uVar98 = (undefined2)(uVar54 >> 0x10);
  auVar41._4_8_ = auVar210._8_8_;
  auVar41._2_2_ = uVar98;
  auVar41._0_2_ = uVar98;
  uVar59 = *(ulong *)(prim + uVar51 * 0x12 + 6);
  uVar98 = (undefined2)(uVar59 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar59;
  auVar77._12_2_ = uVar98;
  auVar77._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar59 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar59;
  auVar76._10_2_ = uVar98;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar98;
  auVar75._0_8_ = uVar59;
  uVar98 = (undefined2)(uVar59 >> 0x10);
  auVar42._4_8_ = auVar75._8_8_;
  auVar42._2_2_ = uVar98;
  auVar42._0_2_ = uVar98;
  fVar139 = (float)(auVar42._0_4_ >> 0x10);
  fVar195 = (float)(auVar75._8_4_ >> 0x10);
  uVar61 = (ulong)(uint)((int)(uVar51 * 5) << 2);
  uVar5 = *(ulong *)(prim + uVar51 * 2 + uVar61 + 6);
  uVar98 = (undefined2)(uVar5 >> 0x30);
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar5;
  auVar234._12_2_ = uVar98;
  auVar234._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar5 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar5;
  auVar233._10_2_ = uVar98;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar98;
  auVar232._0_8_ = uVar5;
  uVar98 = (undefined2)(uVar5 >> 0x10);
  auVar43._4_8_ = auVar232._8_8_;
  auVar43._2_2_ = uVar98;
  auVar43._0_2_ = uVar98;
  uVar61 = *(ulong *)(prim + uVar61 + 6);
  uVar98 = (undefined2)(uVar61 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar61;
  auVar80._12_2_ = uVar98;
  auVar80._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar61 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar61;
  auVar79._10_2_ = uVar98;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar98;
  auVar78._0_8_ = uVar61;
  uVar98 = (undefined2)(uVar61 >> 0x10);
  auVar44._4_8_ = auVar78._8_8_;
  auVar44._2_2_ = uVar98;
  auVar44._0_2_ = uVar98;
  fVar141 = (float)(auVar44._0_4_ >> 0x10);
  fVar196 = (float)(auVar78._8_4_ >> 0x10);
  uVar6 = *(ulong *)(prim + uVar51 * 0x18 + 6);
  uVar98 = (undefined2)(uVar6 >> 0x30);
  auVar252._8_4_ = 0;
  auVar252._0_8_ = uVar6;
  auVar252._12_2_ = uVar98;
  auVar252._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar6 >> 0x20);
  auVar251._12_4_ = auVar252._12_4_;
  auVar251._8_2_ = 0;
  auVar251._0_8_ = uVar6;
  auVar251._10_2_ = uVar98;
  auVar250._10_6_ = auVar251._10_6_;
  auVar250._8_2_ = uVar98;
  auVar250._0_8_ = uVar6;
  uVar98 = (undefined2)(uVar6 >> 0x10);
  auVar45._4_8_ = auVar250._8_8_;
  auVar45._2_2_ = uVar98;
  auVar45._0_2_ = uVar98;
  uVar7 = *(ulong *)(prim + uVar51 * 0x1d + 6);
  uVar98 = (undefined2)(uVar7 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar7;
  auVar83._12_2_ = uVar98;
  auVar83._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar7 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar7;
  auVar82._10_2_ = uVar98;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar98;
  auVar81._0_8_ = uVar7;
  uVar98 = (undefined2)(uVar7 >> 0x10);
  auVar46._4_8_ = auVar81._8_8_;
  auVar46._2_2_ = uVar98;
  auVar46._0_2_ = uVar98;
  fVar158 = (float)(auVar46._0_4_ >> 0x10);
  fVar206 = (float)(auVar81._8_4_ >> 0x10);
  uVar8 = *(ulong *)(prim + uVar51 + (ulong)(byte)PVar10 * 0x20 + 6);
  uVar98 = (undefined2)(uVar8 >> 0x30);
  auVar267._8_4_ = 0;
  auVar267._0_8_ = uVar8;
  auVar267._12_2_ = uVar98;
  auVar267._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar8 >> 0x20);
  auVar266._12_4_ = auVar267._12_4_;
  auVar266._8_2_ = 0;
  auVar266._0_8_ = uVar8;
  auVar266._10_2_ = uVar98;
  auVar265._10_6_ = auVar266._10_6_;
  auVar265._8_2_ = uVar98;
  auVar265._0_8_ = uVar8;
  uVar98 = (undefined2)(uVar8 >> 0x10);
  auVar47._4_8_ = auVar265._8_8_;
  auVar47._2_2_ = uVar98;
  auVar47._0_2_ = uVar98;
  uVar9 = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar51) + 6);
  uVar98 = (undefined2)(uVar9 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar9;
  auVar86._12_2_ = uVar98;
  auVar86._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar9 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar9;
  auVar85._10_2_ = uVar98;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar98;
  auVar84._0_8_ = uVar9;
  uVar98 = (undefined2)(uVar9 >> 0x10);
  auVar48._4_8_ = auVar84._8_8_;
  auVar48._2_2_ = uVar98;
  auVar48._0_2_ = uVar98;
  fVar159 = (float)(auVar48._0_4_ >> 0x10);
  fVar207 = (float)(auVar84._8_4_ >> 0x10);
  uVar51 = *(ulong *)(prim + uVar51 * 0x23 + 6);
  uVar98 = (undefined2)(uVar51 >> 0x30);
  auVar281._8_4_ = 0;
  auVar281._0_8_ = uVar51;
  auVar281._12_2_ = uVar98;
  auVar281._14_2_ = uVar98;
  uVar98 = (undefined2)(uVar51 >> 0x20);
  auVar280._12_4_ = auVar281._12_4_;
  auVar280._8_2_ = 0;
  auVar280._0_8_ = uVar51;
  auVar280._10_2_ = uVar98;
  auVar279._10_6_ = auVar280._10_6_;
  auVar279._8_2_ = uVar98;
  auVar279._0_8_ = uVar51;
  uVar98 = (undefined2)(uVar51 >> 0x10);
  auVar49._4_8_ = auVar279._8_8_;
  auVar49._2_2_ = uVar98;
  auVar49._0_2_ = uVar98;
  auVar146._0_8_ =
       CONCAT44(((((float)(auVar39._0_4_ >> 0x10) - fVar121) * fVar258 + fVar121) - fVar303) *
                fVar100,((((float)(int)(short)uVar52 - (float)(int)(short)uVar58) * fVar258 +
                         (float)(int)(short)uVar58) - fVar296) * fVar140);
  auVar146._8_4_ =
       ((((float)(auVar143._8_4_ >> 0x10) - fVar171) * fVar258 + fVar171) - fVar307) * fVar160;
  auVar146._12_4_ =
       ((((float)(auVar144._12_4_ >> 0x10) - (float)(auVar318._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar318._12_4_ >> 0x10)) - fVar311) * fVar208;
  auVar213._0_4_ =
       ((((float)(int)(short)uVar54 - (float)(int)(short)uVar53) * fVar258 +
        (float)(int)(short)uVar53) - fVar296) * fVar140;
  auVar213._4_4_ =
       ((((float)(auVar41._0_4_ >> 0x10) - fVar122) * fVar258 + fVar122) - fVar303) * fVar100;
  auVar213._8_4_ =
       ((((float)(auVar210._8_4_ >> 0x10) - fVar194) * fVar258 + fVar194) - fVar307) * fVar160;
  auVar213._12_4_ =
       ((((float)(auVar211._12_4_ >> 0x10) - (float)(auVar73._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar73._12_4_ >> 0x10)) - fVar311) * fVar208;
  auVar235._0_8_ =
       CONCAT44(((((float)(auVar43._0_4_ >> 0x10) - fVar139) * fVar258 + fVar139) - fVar243) *
                fVar101,((((float)(int)(short)uVar5 - (float)(int)(short)uVar59) * fVar258 +
                         (float)(int)(short)uVar59) - fVar231) * fVar69);
  auVar235._8_4_ =
       ((((float)(auVar232._8_4_ >> 0x10) - fVar195) * fVar258 + fVar195) - fVar245) * fVar164;
  auVar235._12_4_ =
       ((((float)(auVar233._12_4_ >> 0x10) - (float)(auVar76._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar76._12_4_ >> 0x10)) - fVar295) * fVar217;
  auVar253._0_4_ =
       ((((float)(int)(short)uVar6 - (float)(int)(short)uVar61) * fVar258 +
        (float)(int)(short)uVar61) - fVar231) * fVar69;
  auVar253._4_4_ =
       ((((float)(auVar45._0_4_ >> 0x10) - fVar141) * fVar258 + fVar141) - fVar243) * fVar101;
  auVar253._8_4_ =
       ((((float)(auVar250._8_4_ >> 0x10) - fVar196) * fVar258 + fVar196) - fVar245) * fVar164;
  auVar253._12_4_ =
       ((((float)(auVar251._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar295) * fVar217;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar268._0_8_ =
       CONCAT44(((((float)(auVar47._0_4_ >> 0x10) - fVar158) * fVar258 + fVar158) - fVar229) *
                fVar120,((((float)(int)(short)uVar8 - (float)(int)(short)uVar7) * fVar258 +
                         (float)(int)(short)uVar7) - fVar219) * fVar99);
  auVar268._8_4_ =
       ((((float)(auVar265._8_4_ >> 0x10) - fVar206) * fVar258 + fVar206) - fVar230) * fVar166;
  auVar268._12_4_ =
       ((((float)(auVar266._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar248) * fVar218;
  auVar282._0_4_ =
       ((((float)(int)(short)uVar51 - (float)(int)(short)uVar9) * fVar258 + (float)(int)(short)uVar9
        ) - fVar219) * fVar99;
  auVar282._4_4_ =
       ((((float)(auVar49._0_4_ >> 0x10) - fVar159) * fVar258 + fVar159) - fVar229) * fVar120;
  auVar282._8_4_ =
       ((((float)(auVar279._8_4_ >> 0x10) - fVar207) * fVar258 + fVar207) - fVar230) * fVar166;
  auVar282._12_4_ =
       ((((float)(auVar280._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar258 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar248) * fVar218;
  auVar123._8_4_ = auVar146._8_4_;
  auVar123._0_8_ = auVar146._0_8_;
  auVar123._12_4_ = auVar146._12_4_;
  auVar124 = minps(auVar123,auVar213);
  auVar111._8_4_ = auVar235._8_4_;
  auVar111._0_8_ = auVar235._0_8_;
  auVar111._12_4_ = auVar235._12_4_;
  auVar70 = minps(auVar111,auVar253);
  auVar124 = maxps(auVar124,auVar70);
  auVar112._8_4_ = auVar268._8_4_;
  auVar112._0_8_ = auVar268._0_8_;
  auVar112._12_4_ = auVar268._12_4_;
  auVar70 = minps(auVar112,auVar282);
  auVar87._4_4_ = uVar11;
  auVar87._0_4_ = uVar11;
  auVar87._8_4_ = uVar11;
  auVar87._12_4_ = uVar11;
  auVar70 = maxps(auVar70,auVar87);
  auVar70 = maxps(auVar124,auVar70);
  auVar124 = maxps(auVar146,auVar213);
  auVar236 = maxps(auVar235,auVar253);
  auVar124 = minps(auVar124,auVar236);
  auVar236 = maxps(auVar268,auVar282);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar88._4_4_ = uVar11;
  auVar88._0_4_ = uVar11;
  auVar88._8_4_ = uVar11;
  auVar88._12_4_ = uVar11;
  auVar236 = minps(auVar236,auVar88);
  local_298 = auVar70._0_4_ * 0.99999964;
  fStack_294 = auVar70._4_4_ * 0.99999964;
  fStack_290 = auVar70._8_4_ * 0.99999964;
  fStack_28c = auVar70._12_4_ * 0.99999964;
  auVar70 = minps(auVar124,auVar236);
  uVar63 = (uint)(byte)PVar10;
  auVar89._0_4_ = -(uint)(local_298 <= auVar70._0_4_ * 1.0000004 && uVar63 != 0);
  auVar89._4_4_ = -(uint)(fStack_294 <= auVar70._4_4_ * 1.0000004 && 1 < uVar63);
  auVar89._8_4_ = -(uint)(fStack_290 <= auVar70._8_4_ * 1.0000004 && 2 < uVar63);
  auVar89._12_4_ = -(uint)(fStack_28c <= auVar70._12_4_ * 1.0000004 && 3 < uVar63);
  uVar63 = movmskps(uVar63,auVar89);
  local_54d = uVar63 != 0;
  if (uVar63 == 0) {
    return local_54d;
  }
  uVar63 = uVar63 & 0xff;
  local_278._0_12_ = mm_lookupmask_ps._240_12_;
  local_278._12_4_ = 0;
  local_3f0 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_3e8 = prim;
LAB_00c39f15:
  lVar17 = 0;
  if ((ulong)uVar63 != 0) {
    for (; (uVar63 >> lVar17 & 1) == 0; lVar17 = lVar17 + 1) {
    }
  }
  uVar64 = *(uint *)(local_3e8 + 2);
  uVar66 = *(uint *)(local_3e8 + lVar17 * 4 + 6);
  pGVar12 = (context->scene->geometries).items[uVar64].ptr;
  fVar140 = pGVar12->fnumTimeSegments;
  fVar69 = (pGVar12->time_range).lower;
  fVar99 = ((*(float *)(ray + k * 4 + 0x70) - fVar69) / ((pGVar12->time_range).upper - fVar69)) *
           fVar140;
  fVar69 = floorf(fVar99);
  fVar140 = fVar140 + -1.0;
  if (fVar140 <= fVar69) {
    fVar69 = fVar140;
  }
  fVar140 = 0.0;
  if (0.0 <= fVar69) {
    fVar140 = fVar69;
  }
  uVar52 = (ulong)*(uint *)(*(long *)&pGVar12->field_0x58 +
                           (ulong)uVar66 *
                           pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var13 = pGVar12[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar60 = (long)(int)fVar140 * 0x38;
  lVar14 = *(long *)(_Var13 + lVar60);
  lVar15 = *(long *)(_Var13 + 0x10 + lVar60);
  pfVar3 = (float *)(lVar14 + lVar15 * uVar52);
  fVar69 = *pfVar3;
  fVar100 = pfVar3[1];
  fVar101 = pfVar3[2];
  fVar120 = pfVar3[3];
  lVar17 = uVar52 + 1;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar17);
  fVar121 = *pfVar3;
  fVar122 = pfVar3[1];
  fVar139 = pfVar3[2];
  fVar141 = pfVar3[3];
  lVar1 = uVar52 + 2;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar1);
  fVar158 = *pfVar3;
  fVar159 = pfVar3[1];
  fVar160 = pfVar3[2];
  fVar164 = pfVar3[3];
  lVar2 = uVar52 + 3;
  pfVar3 = (float *)(lVar14 + lVar15 * lVar2);
  fVar166 = *pfVar3;
  fVar171 = pfVar3[1];
  fVar194 = pfVar3[2];
  fVar195 = pfVar3[3];
  lVar14 = *(long *)&pGVar12[4].fnumTimeSegments;
  lVar15 = *(long *)(lVar14 + lVar60);
  lVar16 = *(long *)(lVar14 + 0x10 + lVar60);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar52);
  fVar196 = *pfVar3;
  fVar206 = pfVar3[1];
  fVar207 = pfVar3[2];
  fVar208 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar217 = *pfVar3;
  fVar218 = pfVar3[1];
  fVar231 = pfVar3[2];
  fVar243 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar245 = *pfVar3;
  fVar295 = pfVar3[1];
  fVar219 = pfVar3[2];
  fVar229 = pfVar3[3];
  fVar99 = fVar99 - fVar140;
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar140 = *pfVar3;
  fVar230 = pfVar3[1];
  fVar248 = pfVar3[2];
  fVar258 = pfVar3[3];
  fVar297 = (fVar158 * 0.5 + fVar166 * 0.0 + fVar121 * 0.0) - fVar69 * 0.5;
  fVar304 = (fVar159 * 0.5 + fVar171 * 0.0 + fVar122 * 0.0) - fVar100 * 0.5;
  fVar308 = (fVar160 * 0.5 + fVar194 * 0.0 + fVar139 * 0.0) - fVar101 * 0.5;
  fVar312 = (fVar164 * 0.5 + fVar195 * 0.0 + fVar141 * 0.0) - fVar120 * 0.5;
  fVar311 = (fVar245 * 0.5 + fVar140 * 0.0 + fVar217 * 0.0) - fVar196 * 0.5;
  fVar244 = (fVar295 * 0.5 + fVar230 * 0.0 + fVar218 * 0.0) - fVar206 * 0.5;
  fVar246 = (fVar219 * 0.5 + fVar248 * 0.0 + fVar231 * 0.0) - fVar207 * 0.5;
  fVar247 = (fVar229 * 0.5 + fVar258 * 0.0 + fVar243 * 0.0) - fVar208 * 0.5;
  fVar260 = fVar158 * 0.0 + fVar166 * -0.0 + fVar121 + fVar69 * -0.0;
  fVar263 = fVar159 * 0.0 + fVar171 * -0.0 + fVar122 + fVar100 * -0.0;
  fVar272 = fVar160 * 0.0 + fVar194 * -0.0 + fVar139 + fVar101 * -0.0;
  fVar273 = fVar164 * 0.0 + fVar195 * -0.0 + fVar141 + fVar120 * -0.0;
  fVar298 = fVar245 * 0.0 + fVar140 * -0.0 + fVar217 + fVar196 * -0.0;
  fVar305 = fVar295 * 0.0 + fVar230 * -0.0 + fVar218 + fVar206 * -0.0;
  fVar309 = fVar219 * 0.0 + fVar248 * -0.0 + fVar231 + fVar207 * -0.0;
  fVar313 = fVar229 * 0.0 + fVar258 * -0.0 + fVar243 + fVar208 * -0.0;
  fVar275 = fVar166 * -0.0 + fVar158 + fVar121 * 0.0 + fVar69 * -0.0;
  fVar289 = fVar171 * -0.0 + fVar159 + fVar122 * 0.0 + fVar100 * -0.0;
  fVar296 = fVar194 * -0.0 + fVar160 + fVar139 * 0.0 + fVar101 * -0.0;
  fVar307 = fVar195 * -0.0 + fVar164 + fVar141 * 0.0 + fVar120 * -0.0;
  fVar274 = fVar69 * 0.0 + ((fVar166 * 0.5 + fVar158 * 0.0) - fVar121 * 0.5);
  fVar286 = fVar100 * 0.0 + ((fVar171 * 0.5 + fVar159 * 0.0) - fVar122 * 0.5);
  fVar292 = fVar101 * 0.0 + ((fVar194 * 0.5 + fVar160 * 0.0) - fVar139 * 0.5);
  fVar303 = fVar120 * 0.0 + ((fVar195 * 0.5 + fVar164 * 0.0) - fVar141 * 0.5);
  fVar101 = fVar140 * -0.0 + fVar245 + fVar217 * 0.0 + fVar196 * -0.0;
  fVar120 = fVar230 * -0.0 + fVar295 + fVar218 * 0.0 + fVar206 * -0.0;
  fVar121 = fVar248 * -0.0 + fVar219 + fVar231 * 0.0 + fVar207 * -0.0;
  fVar122 = fVar258 * -0.0 + fVar229 + fVar243 * 0.0 + fVar208 * -0.0;
  fVar140 = fVar196 * 0.0 + ((fVar140 * 0.5 + fVar245 * 0.0) - fVar217 * 0.5);
  fVar69 = fVar206 * 0.0 + ((fVar230 * 0.5 + fVar295 * 0.0) - fVar218 * 0.5);
  fVar100 = fVar207 * 0.0 + ((fVar248 * 0.5 + fVar219 * 0.0) - fVar231 * 0.5);
  fVar196 = fVar208 * 0.0 + ((fVar258 * 0.5 + fVar229 * 0.0) - fVar243 * 0.5);
  fVar276 = fVar304 * fVar298 - fVar305 * fVar297;
  fVar287 = fVar308 * fVar305 - fVar309 * fVar304;
  fVar290 = fVar297 * fVar309 - fVar298 * fVar308;
  fVar293 = fVar312 * fVar313 - fVar313 * fVar312;
  fVar218 = fVar304 * fVar311 - fVar244 * fVar297;
  fVar243 = fVar308 * fVar244 - fVar246 * fVar304;
  fVar245 = fVar297 * fVar246 - fVar311 * fVar308;
  fVar230 = fVar286 * fVar101 - fVar120 * fVar274;
  fVar248 = fVar292 * fVar120 - fVar121 * fVar286;
  fVar258 = fVar274 * fVar121 - fVar101 * fVar292;
  fVar309 = fVar303 * fVar122 - fVar122 * fVar303;
  fVar207 = fVar286 * fVar140 - fVar69 * fVar274;
  fVar208 = fVar292 * fVar69 - fVar100 * fVar286;
  fVar217 = fVar274 * fVar100 - fVar140 * fVar292;
  fVar195 = fVar290 * fVar290 + fVar287 * fVar287 + fVar276 * fVar276;
  auVar124 = ZEXT416((uint)fVar195);
  auVar70 = rsqrtss(ZEXT416((uint)fVar195),auVar124);
  fVar140 = auVar70._0_4_;
  fVar244 = fVar140 * 1.5 - fVar140 * fVar140 * fVar195 * 0.5 * fVar140;
  fVar219 = fVar276 * fVar218 + fVar290 * fVar245 + fVar287 * fVar243;
  fVar295 = fVar293 * fVar244;
  auVar70 = rcpss(auVar124,auVar124);
  fVar229 = (2.0 - fVar195 * auVar70._0_4_) * auVar70._0_4_;
  fVar231 = fVar258 * fVar258 + fVar248 * fVar248 + fVar230 * fVar230;
  auVar124 = ZEXT416((uint)fVar231);
  auVar70 = rsqrtss(ZEXT416((uint)fVar231),auVar124);
  fVar140 = auVar70._0_4_;
  fVar313 = fVar140 * 1.5 - fVar140 * fVar140 * fVar231 * 0.5 * fVar140;
  fVar315 = fVar230 * fVar207 + fVar258 * fVar217 + fVar248 * fVar208;
  lVar15 = *(long *)(_Var13 + 0x38 + lVar60);
  lVar16 = *(long *)(_Var13 + 0x48 + lVar60);
  pfVar3 = (float *)(lVar15 + lVar16 * uVar52);
  fVar140 = *pfVar3;
  fVar69 = pfVar3[1];
  fVar100 = pfVar3[2];
  fVar101 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar17);
  fVar120 = *pfVar3;
  fVar121 = pfVar3[1];
  fVar122 = pfVar3[2];
  fVar139 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar16 * lVar1);
  fVar141 = *pfVar3;
  fVar158 = pfVar3[1];
  fVar159 = pfVar3[2];
  fVar160 = pfVar3[3];
  auVar70 = rcpss(auVar124,auVar124);
  pfVar3 = (float *)(lVar15 + lVar16 * lVar2);
  fVar164 = *pfVar3;
  fVar166 = pfVar3[1];
  fVar171 = pfVar3[2];
  fVar194 = pfVar3[3];
  fVar206 = fVar309 * fVar313;
  fVar316 = (2.0 - fVar231 * auVar70._0_4_) * auVar70._0_4_;
  fVar299 = fVar273 * fVar287 * fVar244;
  fVar306 = fVar273 * fVar290 * fVar244;
  fVar310 = fVar273 * fVar276 * fVar244;
  fVar314 = fVar273 * fVar295;
  fVar311 = fVar260 - fVar299;
  fVar246 = fVar263 - fVar306;
  fVar298 = fVar272 - fVar310;
  fVar305 = fVar273 - fVar314;
  fVar277 = fVar273 * fVar229 * (fVar195 * fVar243 - fVar219 * fVar287) * fVar244 +
            fVar312 * fVar287 * fVar244;
  fVar288 = fVar273 * fVar229 * (fVar195 * fVar245 - fVar219 * fVar290) * fVar244 +
            fVar312 * fVar290 * fVar244;
  fVar291 = fVar273 * fVar229 * (fVar195 * fVar218 - fVar219 * fVar276) * fVar244 +
            fVar312 * fVar276 * fVar244;
  fVar294 = fVar273 * fVar229 * (fVar195 * (fVar312 * fVar247 - fVar247 * fVar312) -
                                fVar219 * fVar293) * fVar244 + fVar312 * fVar295;
  fVar299 = fVar299 + fVar260;
  fVar306 = fVar306 + fVar263;
  fVar310 = fVar310 + fVar272;
  fVar314 = fVar314 + fVar273;
  fVar260 = fVar307 * fVar248 * fVar313;
  fVar263 = fVar307 * fVar258 * fVar313;
  fVar272 = fVar307 * fVar230 * fVar313;
  fVar273 = fVar307 * fVar206;
  fVar244 = fVar275 - fVar260;
  fVar247 = fVar289 - fVar263;
  fVar276 = fVar296 - fVar272;
  fVar287 = fVar307 - fVar273;
  fVar161 = fVar307 * fVar316 * (fVar231 * fVar208 - fVar315 * fVar248) * fVar313 +
            fVar303 * fVar248 * fVar313;
  fVar165 = fVar307 * fVar316 * (fVar231 * fVar217 - fVar315 * fVar258) * fVar313 +
            fVar303 * fVar258 * fVar313;
  fVar167 = fVar307 * fVar316 * (fVar231 * fVar207 - fVar315 * fVar230) * fVar313 +
            fVar303 * fVar230 * fVar313;
  fVar169 = fVar307 * fVar316 * (fVar231 * (fVar303 * fVar196 - fVar196 * fVar303) -
                                fVar315 * fVar309) * fVar313 + fVar303 * fVar206;
  fVar260 = fVar260 + fVar275;
  fVar263 = fVar263 + fVar289;
  fVar272 = fVar272 + fVar296;
  fVar273 = fVar273 + fVar307;
  fVar315 = (fVar141 * 0.5 + fVar164 * 0.0 + fVar120 * 0.0) - fVar140 * 0.5;
  fVar316 = (fVar158 * 0.5 + fVar166 * 0.0 + fVar121 * 0.0) - fVar69 * 0.5;
  fVar168 = (fVar159 * 0.5 + fVar171 * 0.0 + fVar122 * 0.0) - fVar100 * 0.5;
  fVar170 = (fVar160 * 0.5 + fVar194 * 0.0 + fVar139 * 0.0) - fVar101 * 0.5;
  lVar15 = *(long *)(lVar14 + 0x38 + lVar60);
  lVar14 = *(long *)(lVar14 + 0x48 + lVar60);
  uVar58 = lVar17 * lVar14;
  pfVar3 = (float *)(lVar15 + lVar14 * lVar2);
  fVar195 = *pfVar3;
  fVar196 = pfVar3[1];
  fVar206 = pfVar3[2];
  fVar207 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + lVar1 * lVar14);
  fVar208 = *pfVar3;
  fVar217 = pfVar3[1];
  fVar218 = pfVar3[2];
  fVar231 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar58);
  fVar243 = *pfVar3;
  fVar245 = pfVar3[1];
  fVar295 = pfVar3[2];
  fVar219 = pfVar3[3];
  pfVar3 = (float *)(lVar15 + uVar52 * lVar14);
  fVar229 = *pfVar3;
  fVar230 = pfVar3[1];
  fVar248 = pfVar3[2];
  fVar258 = pfVar3[3];
  fVar249 = (fVar208 * 0.5 + fVar195 * 0.0 + fVar243 * 0.0) - fVar229 * 0.5;
  fVar259 = (fVar217 * 0.5 + fVar196 * 0.0 + fVar245 * 0.0) - fVar230 * 0.5;
  fVar261 = (fVar218 * 0.5 + fVar206 * 0.0 + fVar295 * 0.0) - fVar248 * 0.5;
  fVar262 = (fVar231 * 0.5 + fVar207 * 0.0 + fVar219 * 0.0) - fVar258 * 0.5;
  fVar309 = fVar141 * 0.0 + fVar164 * -0.0 + fVar120 + fVar140 * -0.0;
  fVar313 = fVar158 * 0.0 + fVar166 * -0.0 + fVar121 + fVar69 * -0.0;
  fVar290 = fVar159 * 0.0 + fVar171 * -0.0 + fVar122 + fVar100 * -0.0;
  fVar293 = fVar160 * 0.0 + fVar194 * -0.0 + fVar139 + fVar101 * -0.0;
  fVar275 = fVar164 * -0.0 + fVar141 + fVar120 * 0.0 + fVar140 * -0.0;
  fVar289 = fVar166 * -0.0 + fVar158 + fVar121 * 0.0 + fVar69 * -0.0;
  fVar296 = fVar171 * -0.0 + fVar159 + fVar122 * 0.0 + fVar100 * -0.0;
  fVar307 = fVar194 * -0.0 + fVar160 + fVar139 * 0.0 + fVar101 * -0.0;
  fVar140 = fVar140 * 0.0 + ((fVar164 * 0.5 + fVar141 * 0.0) - fVar120 * 0.5);
  fVar69 = fVar69 * 0.0 + ((fVar166 * 0.5 + fVar158 * 0.0) - fVar121 * 0.5);
  fVar100 = fVar100 * 0.0 + ((fVar171 * 0.5 + fVar159 * 0.0) - fVar122 * 0.5);
  fVar101 = fVar101 * 0.0 + ((fVar194 * 0.5 + fVar160 * 0.0) - fVar139 * 0.5);
  fVar120 = fVar208 * 0.0 + fVar195 * -0.0 + fVar243 + fVar229 * -0.0;
  fVar141 = fVar217 * 0.0 + fVar196 * -0.0 + fVar245 + fVar230 * -0.0;
  fVar158 = fVar218 * 0.0 + fVar206 * -0.0 + fVar295 + fVar248 * -0.0;
  fVar159 = fVar231 * 0.0 + fVar207 * -0.0 + fVar219 + fVar258 * -0.0;
  fVar121 = fVar195 * -0.0 + fVar208 + fVar243 * 0.0 + fVar229 * -0.0;
  fVar122 = fVar196 * -0.0 + fVar217 + fVar245 * 0.0 + fVar230 * -0.0;
  fVar139 = fVar206 * -0.0 + fVar218 + fVar295 * 0.0 + fVar248 * -0.0;
  fVar160 = fVar207 * -0.0 + fVar231 + fVar219 * 0.0 + fVar258 * -0.0;
  fVar164 = fVar229 * 0.0 + ((fVar195 * 0.5 + fVar208 * 0.0) - fVar243 * 0.5);
  fVar194 = fVar230 * 0.0 + ((fVar196 * 0.5 + fVar217 * 0.0) - fVar245 * 0.5);
  fVar195 = fVar248 * 0.0 + ((fVar206 * 0.5 + fVar218 * 0.0) - fVar295 * 0.5);
  fVar229 = fVar258 * 0.0 + ((fVar207 * 0.5 + fVar231 * 0.0) - fVar219 * 0.5);
  fVar196 = fVar316 * fVar120 - fVar141 * fVar315;
  fVar207 = fVar168 * fVar141 - fVar158 * fVar316;
  fVar217 = fVar315 * fVar158 - fVar120 * fVar168;
  fVar231 = fVar170 * fVar159 - fVar159 * fVar170;
  fVar120 = fVar316 * fVar249 - fVar259 * fVar315;
  fVar166 = fVar168 * fVar259 - fVar261 * fVar316;
  fVar171 = fVar315 * fVar261 - fVar249 * fVar168;
  fVar141 = fVar69 * fVar121 - fVar122 * fVar140;
  fVar158 = fVar100 * fVar122 - fVar139 * fVar69;
  fVar159 = fVar140 * fVar139 - fVar121 * fVar100;
  fVar160 = fVar101 * fVar160 - fVar160 * fVar101;
  fVar121 = fVar69 * fVar164 - fVar194 * fVar140;
  fVar122 = fVar100 * fVar194 - fVar195 * fVar69;
  fVar139 = fVar140 * fVar195 - fVar164 * fVar100;
  fVar195 = fVar217 * fVar217 + fVar207 * fVar207 + fVar196 * fVar196;
  auVar70 = ZEXT416((uint)fVar195);
  auVar124 = rsqrtss(ZEXT416((uint)fVar195),auVar70);
  fVar164 = auVar124._0_4_;
  fVar206 = fVar164 * 1.5 - fVar164 * fVar164 * fVar195 * 0.5 * fVar164;
  fVar249 = fVar196 * fVar120 + fVar217 * fVar171 + fVar207 * fVar166;
  auVar70 = rcpss(auVar70,auVar70);
  fVar164 = (2.0 - fVar195 * auVar70._0_4_) * auVar70._0_4_;
  fVar194 = fVar231 * fVar206;
  fVar230 = fVar159 * fVar159 + fVar158 * fVar158 + fVar141 * fVar141;
  auVar70 = ZEXT416((uint)fVar230);
  auVar124 = rsqrtss(ZEXT416((uint)fVar230),auVar70);
  fVar208 = auVar124._0_4_;
  fVar258 = fVar208 * 1.5 - fVar208 * fVar208 * fVar230 * 0.5 * fVar208;
  fVar259 = fVar141 * fVar121 + fVar159 * fVar139 + fVar158 * fVar122;
  auVar70 = rcpss(auVar70,auVar70);
  fVar261 = (2.0 - fVar230 * auVar70._0_4_) * auVar70._0_4_;
  fVar248 = fVar160 * fVar258;
  fVar243 = fVar293 * fVar207 * fVar206;
  fVar245 = fVar293 * fVar217 * fVar206;
  fVar295 = fVar293 * fVar196 * fVar206;
  fVar219 = fVar293 * fVar194;
  fVar208 = fVar293 * fVar164 * (fVar195 * fVar166 - fVar249 * fVar207) * fVar206 +
            fVar170 * fVar207 * fVar206;
  fVar217 = fVar293 * fVar164 * (fVar195 * fVar171 - fVar249 * fVar217) * fVar206 +
            fVar170 * fVar217 * fVar206;
  fVar218 = fVar293 * fVar164 * (fVar195 * fVar120 - fVar249 * fVar196) * fVar206 +
            fVar170 * fVar196 * fVar206;
  fVar231 = fVar293 * fVar164 * (fVar195 * (fVar170 * fVar262 - fVar262 * fVar170) -
                                fVar249 * fVar231) * fVar206 + fVar170 * fVar194;
  fVar164 = fVar309 - fVar243;
  fVar166 = fVar313 - fVar245;
  fVar171 = fVar290 - fVar295;
  fVar194 = fVar293 - fVar219;
  fVar243 = fVar243 + fVar309;
  fVar245 = fVar245 + fVar313;
  fVar295 = fVar295 + fVar290;
  fVar219 = fVar219 + fVar293;
  fVar120 = fVar307 * fVar158 * fVar258;
  fVar196 = fVar307 * fVar159 * fVar258;
  fVar206 = fVar307 * fVar141 * fVar258;
  fVar207 = fVar307 * fVar248;
  fVar309 = fVar307 * fVar261 * (fVar230 * fVar122 - fVar259 * fVar158) * fVar258 +
            fVar101 * fVar158 * fVar258;
  fVar313 = fVar307 * fVar261 * (fVar230 * fVar139 - fVar259 * fVar159) * fVar258 +
            fVar101 * fVar159 * fVar258;
  fVar290 = fVar307 * fVar261 * (fVar230 * fVar121 - fVar259 * fVar141) * fVar258 +
            fVar101 * fVar141 * fVar258;
  fVar293 = fVar307 * fVar261 * (fVar230 * (fVar101 * fVar229 - fVar229 * fVar101) -
                                fVar259 * fVar160) * fVar258 + fVar101 * fVar248;
  fVar121 = fVar275 - fVar120;
  fVar122 = fVar289 - fVar196;
  fVar139 = fVar296 - fVar206;
  fVar141 = fVar307 - fVar207;
  fVar120 = fVar120 + fVar275;
  fVar196 = fVar196 + fVar289;
  fVar206 = fVar206 + fVar296;
  fVar207 = fVar207 + fVar307;
  fVar289 = 1.0 - fVar99;
  fVar296 = fVar311 * fVar289 + fVar164 * fVar99;
  fVar307 = fVar246 * fVar289 + fVar166 * fVar99;
  fVar249 = fVar298 * fVar289 + fVar171 * fVar99;
  fVar259 = fVar305 * fVar289 + fVar194 * fVar99;
  fVar311 = ((fVar297 - fVar277) * 0.33333334 + fVar311) * fVar289 +
            ((fVar315 - fVar208) * 0.33333334 + fVar164) * fVar99;
  fVar246 = ((fVar304 - fVar288) * 0.33333334 + fVar246) * fVar289 +
            ((fVar316 - fVar217) * 0.33333334 + fVar166) * fVar99;
  fVar298 = ((fVar308 - fVar291) * 0.33333334 + fVar298) * fVar289 +
            ((fVar168 - fVar218) * 0.33333334 + fVar171) * fVar99;
  fVar305 = ((fVar312 - fVar294) * 0.33333334 + fVar305) * fVar289 +
            ((fVar170 - fVar231) * 0.33333334 + fVar194) * fVar99;
  fVar229 = (fVar244 - (fVar274 - fVar161) * 0.33333334) * fVar289 +
            (fVar121 - (fVar140 - fVar309) * 0.33333334) * fVar99;
  fVar230 = (fVar247 - (fVar286 - fVar165) * 0.33333334) * fVar289 +
            (fVar122 - (fVar69 - fVar313) * 0.33333334) * fVar99;
  fVar248 = (fVar276 - (fVar292 - fVar167) * 0.33333334) * fVar289 +
            (fVar139 - (fVar100 - fVar290) * 0.33333334) * fVar99;
  fVar258 = (fVar287 - (fVar303 - fVar169) * 0.33333334) * fVar289 +
            (fVar141 - (fVar101 - fVar293) * 0.33333334) * fVar99;
  fVar158 = fVar244 * fVar289 + fVar121 * fVar99;
  fVar160 = fVar247 * fVar289 + fVar122 * fVar99;
  fVar166 = fVar276 * fVar289 + fVar139 * fVar99;
  fVar194 = fVar287 * fVar289 + fVar141 * fVar99;
  fVar159 = fVar299 * fVar289 + fVar243 * fVar99;
  fVar164 = fVar306 * fVar289 + fVar245 * fVar99;
  fVar171 = fVar310 * fVar289 + fVar295 * fVar99;
  fVar195 = fVar314 * fVar289 + fVar219 * fVar99;
  fVar243 = ((fVar277 + fVar297) * 0.33333334 + fVar299) * fVar289 +
            ((fVar208 + fVar315) * 0.33333334 + fVar243) * fVar99;
  fVar245 = ((fVar288 + fVar304) * 0.33333334 + fVar306) * fVar289 +
            ((fVar217 + fVar316) * 0.33333334 + fVar245) * fVar99;
  fVar275 = ((fVar291 + fVar308) * 0.33333334 + fVar310) * fVar289 +
            ((fVar218 + fVar168) * 0.33333334 + fVar295) * fVar99;
  fVar219 = ((fVar294 + fVar312) * 0.33333334 + fVar314) * fVar289 +
            ((fVar231 + fVar170) * 0.33333334 + fVar219) * fVar99;
  fVar121 = (fVar260 - (fVar161 + fVar274) * 0.33333334) * fVar289 +
            (fVar120 - (fVar309 + fVar140) * 0.33333334) * fVar99;
  fVar122 = (fVar263 - (fVar165 + fVar286) * 0.33333334) * fVar289 +
            (fVar196 - (fVar313 + fVar69) * 0.33333334) * fVar99;
  fVar139 = (fVar272 - (fVar167 + fVar292) * 0.33333334) * fVar289 +
            (fVar206 - (fVar290 + fVar100) * 0.33333334) * fVar99;
  fVar141 = (fVar273 - (fVar169 + fVar303) * 0.33333334) * fVar289 +
            (fVar207 - (fVar293 + fVar101) * 0.33333334) * fVar99;
  local_288 = fVar289 * fVar260 + fVar99 * fVar120;
  fStack_284 = fVar289 * fVar263 + fVar99 * fVar196;
  fStack_280 = fVar289 * fVar272 + fVar99 * fVar206;
  fStack_27c = fVar289 * fVar273 + fVar99 * fVar207;
  local_1c8 = *(float *)(ray + k * 4);
  fStack_1c4 = *(float *)(ray + k * 4 + 0x10);
  fStack_1c0 = *(float *)(ray + k * 4 + 0x20);
  local_158 = fVar296 - local_1c8;
  fStack_154 = fVar307 - fStack_1c4;
  fStack_150 = fVar249 - fStack_1c0;
  fStack_14c = fVar259 - 0.0;
  fVar140 = pre->ray_space[k].vx.field_0.m128[0];
  fVar69 = pre->ray_space[k].vx.field_0.m128[1];
  fVar99 = pre->ray_space[k].vy.field_0.m128[0];
  fVar100 = pre->ray_space[k].vy.field_0.m128[1];
  fVar101 = pre->ray_space[k].vz.field_0.m128[0];
  fVar120 = pre->ray_space[k].vz.field_0.m128[1];
  fVar196 = local_158 * fVar140 + fStack_154 * fVar99 + fStack_150 * fVar101;
  fVar207 = local_158 * fVar69 + fStack_154 * fVar100 + fStack_150 * fVar120;
  local_168 = fVar311 - local_1c8;
  fStack_164 = fVar246 - fStack_1c4;
  fStack_160 = fVar298 - fStack_1c0;
  fStack_15c = fVar305 - 0.0;
  fVar217 = local_168 * fVar140 + fStack_164 * fVar99 + fStack_160 * fVar101;
  fVar218 = local_168 * fVar69 + fStack_164 * fVar100 + fStack_160 * fVar120;
  local_348 = CONCAT44(fVar218,fVar217);
  local_178 = fVar229 - local_1c8;
  fStack_174 = fVar230 - fStack_1c4;
  fStack_170 = fVar248 - fStack_1c0;
  fStack_16c = fVar258 - 0.0;
  fVar231 = local_178 * fVar140 + fStack_174 * fVar99 + fStack_170 * fVar101;
  fVar295 = local_178 * fVar69 + fStack_174 * fVar100 + fStack_170 * fVar120;
  local_358 = CONCAT44(fVar295,fVar231);
  local_188 = fVar158 - local_1c8;
  fStack_184 = fVar160 - fStack_1c4;
  fStack_180 = fVar166 - fStack_1c0;
  fStack_17c = fVar194 - 0.0;
  fVar206 = local_188 * fVar140 + fStack_184 * fVar99 + fStack_180 * fVar101;
  fVar208 = local_188 * fVar69 + fStack_184 * fVar100 + fStack_180 * fVar120;
  local_368 = CONCAT44(fVar208,fVar206);
  local_198 = fVar159 - local_1c8;
  fStack_194 = fVar164 - fStack_1c4;
  fStack_190 = fVar171 - fStack_1c0;
  fStack_18c = fVar195 - 0.0;
  fVar260 = local_198 * fVar140 + fStack_194 * fVar99 + fStack_190 * fVar101;
  fVar263 = local_198 * fVar69 + fStack_194 * fVar100 + fStack_190 * fVar120;
  local_378 = CONCAT44(fVar263,fVar260);
  local_1a8 = fVar243 - local_1c8;
  fStack_1a4 = fVar245 - fStack_1c4;
  fStack_1a0 = fVar275 - fStack_1c0;
  fStack_19c = fVar219 - 0.0;
  fVar272 = local_1a8 * fVar140 + fStack_1a4 * fVar99 + fStack_1a0 * fVar101;
  fVar273 = local_1a8 * fVar69 + fStack_1a4 * fVar100 + fStack_1a0 * fVar120;
  local_388 = CONCAT44(fVar273,fVar272);
  local_1b8 = fVar121 - local_1c8;
  fStack_1b4 = fVar122 - fStack_1c4;
  fStack_1b0 = fVar139 - fStack_1c0;
  fStack_1ac = fVar141 - 0.0;
  fVar274 = local_1b8 * fVar140 + fStack_1b4 * fVar99 + fStack_1b0 * fVar101;
  fVar286 = local_1b8 * fVar69 + fStack_1b4 * fVar100 + fStack_1b0 * fVar120;
  local_398 = CONCAT44(fVar286,fVar274);
  local_1c8 = local_288 - local_1c8;
  fStack_1c4 = fStack_284 - fStack_1c4;
  fStack_1c0 = fStack_280 - fStack_1c0;
  fStack_1bc = fStack_27c - 0.0;
  fVar99 = local_1c8 * fVar140 + fStack_1c4 * fVar99 + fStack_1c0 * fVar101;
  fVar69 = local_1c8 * fVar69 + fStack_1c4 * fVar100 + fStack_1c0 * fVar120;
  local_3a8 = CONCAT44(fVar69,fVar99);
  auVar147._8_8_ = local_388;
  auVar147._0_8_ = local_348;
  register0x00001488 = local_3a8;
  local_148 = local_368;
  auVar90._8_4_ = fVar260;
  auVar90._0_8_ = CONCAT44(fVar207,fVar196);
  auVar90._12_4_ = fVar263;
  auVar70 = minps(auVar90,auVar147);
  auVar113._8_4_ = fVar274;
  auVar113._0_8_ = local_358;
  auVar113._12_4_ = fVar286;
  auVar124 = minps(auVar113,_local_148);
  auVar70 = minps(auVar70,auVar124);
  auVar114._8_4_ = fVar260;
  auVar114._0_8_ = CONCAT44(fVar207,fVar196);
  auVar114._12_4_ = fVar263;
  auVar124 = maxps(auVar114,auVar147);
  auVar125._4_4_ = fVar295;
  auVar125._0_4_ = fVar231;
  auVar125._8_4_ = fVar274;
  auVar125._12_4_ = fVar286;
  auVar126 = maxps(auVar125,_local_148);
  auVar236 = maxps(auVar124,auVar126);
  auVar18._4_8_ = auVar126._8_8_;
  auVar18._0_4_ = auVar70._4_4_;
  auVar127._0_8_ = auVar18._0_8_ << 0x20;
  auVar127._8_4_ = auVar70._8_4_;
  auVar127._12_4_ = auVar70._12_4_;
  auVar128._8_8_ = auVar70._8_8_;
  auVar128._0_8_ = auVar127._8_8_;
  auVar124 = minps(auVar70,auVar128);
  auVar19._4_8_ = auVar70._8_8_;
  auVar19._0_4_ = auVar236._4_4_;
  auVar129._0_8_ = auVar19._0_8_ << 0x20;
  auVar129._8_4_ = auVar236._8_4_;
  auVar129._12_4_ = auVar236._12_4_;
  auVar130._8_8_ = auVar236._8_8_;
  auVar130._0_8_ = auVar129._8_8_;
  auVar70 = maxps(auVar236,auVar130);
  auVar91._0_8_ = auVar124._0_8_ & 0x7fffffff7fffffff;
  auVar91._8_4_ = auVar124._8_4_ & 0x7fffffff;
  auVar91._12_4_ = auVar124._12_4_ & 0x7fffffff;
  auVar115._0_8_ = auVar70._0_8_ & 0x7fffffff7fffffff;
  auVar115._8_4_ = auVar70._8_4_ & 0x7fffffff;
  auVar115._12_4_ = auVar70._12_4_ & 0x7fffffff;
  auVar70 = maxps(auVar91,auVar115);
  fVar140 = auVar70._4_4_;
  if (auVar70._4_4_ <= auVar70._0_4_) {
    fVar140 = auVar70._0_4_;
  }
  local_3e0 = (ulong)uVar63 + 0xf;
  fVar140 = fVar140 * 9.536743e-07;
  local_258 = fVar140;
  fStack_254 = fVar140;
  fStack_250 = fVar140;
  fStack_24c = fVar140;
  local_268 = -fVar140;
  fStack_264 = -fVar140;
  fStack_260 = -fVar140;
  fStack_25c = -fVar140;
  local_118 = fVar217 - fVar196;
  fStack_114 = fVar218 - fVar207;
  fStack_110 = fVar272 - fVar260;
  fStack_10c = fVar273 - fVar263;
  local_128 = fVar231 - fVar217;
  fStack_124 = fVar295 - fVar218;
  fStack_120 = fVar274 - fVar272;
  fStack_11c = fVar286 - fVar273;
  local_138 = fVar206 - fVar231;
  fStack_134 = fVar208 - fVar295;
  fStack_130 = fVar99 - fVar274;
  fStack_12c = fVar69 - fVar286;
  local_2a8 = fVar159 - fVar296;
  fStack_2a4 = fVar164 - fVar307;
  fStack_2a0 = fVar171 - fVar249;
  fStack_29c = fVar195 - fVar259;
  local_2b8 = fVar243 - fVar311;
  fStack_2b4 = fVar245 - fVar246;
  fStack_2b0 = fVar275 - fVar298;
  fStack_2ac = fVar219 - fVar305;
  local_2c8 = fVar121 - fVar229;
  fStack_2c4 = fVar122 - fVar230;
  fStack_2c0 = fVar139 - fVar248;
  fStack_2bc = fVar141 - fVar258;
  local_2d8 = local_288 - fVar158;
  fStack_2d4 = fStack_284 - fVar160;
  fStack_2d0 = fStack_280 - fVar166;
  fStack_2cc = fStack_27c - fVar194;
  local_2e8 = uVar64;
  uStack_2e4 = uVar64;
  uStack_2e0 = uVar64;
  uStack_2dc = uVar64;
  local_2f8 = uVar66;
  uStack_2f4 = uVar66;
  uStack_2f0 = uVar66;
  uStack_2ec = uVar66;
  local_54c = 0;
  uVar52 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x30);
  local_538 = 0x3f80000000000000;
  local_528 = 0x3f80000000000000;
  uStack_3a0 = local_3a8;
  uStack_390 = local_398;
  uStack_380 = local_388;
  uStack_370 = local_378;
  uStack_360 = local_368;
  uStack_350 = local_358;
  uStack_340 = local_348;
  do {
    fVar99 = 1.0 - (float)local_538;
    fVar100 = 1.0 - (float)local_538;
    fVar101 = 1.0 - local_538._4_4_;
    fVar120 = 1.0 - local_538._4_4_;
    fVar141 = fVar196 * fVar99 + (float)local_378 * (float)local_538;
    fVar258 = fVar207 * fVar100 + local_378._4_4_ * (float)local_538;
    fVar292 = fVar196 * fVar101 + (float)uStack_370 * local_538._4_4_;
    fVar247 = fVar207 * fVar120 + uStack_370._4_4_ * local_538._4_4_;
    fVar231 = (float)local_348 * fVar99 + (float)local_388 * (float)local_538;
    fVar303 = local_348._4_4_ * fVar100 + local_388._4_4_ * (float)local_538;
    fVar313 = (float)uStack_340 * fVar101 + (float)uStack_380 * local_538._4_4_;
    fVar290 = uStack_340._4_4_ * fVar120 + uStack_380._4_4_ * local_538._4_4_;
    fVar287 = (float)local_358 * fVar99 + (float)local_398 * (float)local_538;
    fVar309 = local_358._4_4_ * fVar100 + local_398._4_4_ * (float)local_538;
    fVar293 = (float)uStack_350 * fVar101 + (float)uStack_390 * local_538._4_4_;
    fVar165 = uStack_350._4_4_ * fVar120 + uStack_390._4_4_ * local_538._4_4_;
    fVar161 = fVar99 * (float)local_368 + (float)local_538 * (float)local_3a8;
    fVar315 = fVar100 * local_368._4_4_ + (float)local_538 * local_3a8._4_4_;
    fVar277 = fVar101 * (float)uStack_360 + local_538._4_4_ * (float)uStack_3a0;
    fVar288 = fVar120 * uStack_360._4_4_ + local_538._4_4_ * uStack_3a0._4_4_;
    fVar99 = (local_528._4_4_ - (float)local_528) * 0.11111111;
    fVar316 = (local_528._4_4_ - (float)local_528) * 0.0 + (float)local_528;
    fVar167 = (local_528._4_4_ - (float)local_528) * 0.33333334 + (float)local_528;
    fVar168 = (local_528._4_4_ - (float)local_528) * 0.6666667 + (float)local_528;
    fVar169 = (local_528._4_4_ - (float)local_528) * 1.0 + (float)local_528;
    fVar170 = 1.0 - fVar316;
    fVar259 = 1.0 - fVar167;
    fVar261 = 1.0 - fVar168;
    fVar262 = 1.0 - fVar169;
    fVar194 = fVar231 * fVar170 + fVar287 * fVar316;
    fVar195 = fVar231 * fVar259 + fVar287 * fVar167;
    fVar206 = fVar231 * fVar261 + fVar287 * fVar168;
    fVar208 = fVar231 * fVar262 + fVar287 * fVar169;
    fVar289 = fVar303 * fVar170 + fVar309 * fVar316;
    fVar244 = fVar303 * fVar259 + fVar309 * fVar167;
    fVar276 = fVar303 * fVar261 + fVar309 * fVar168;
    fVar305 = fVar303 * fVar262 + fVar309 * fVar169;
    fVar100 = (fVar141 * fVar170 + fVar231 * fVar316) * fVar170 + fVar316 * fVar194;
    fVar101 = (fVar141 * fVar259 + fVar231 * fVar167) * fVar259 + fVar167 * fVar195;
    fVar120 = (fVar141 * fVar261 + fVar231 * fVar168) * fVar261 + fVar168 * fVar206;
    fVar141 = (fVar141 * fVar262 + fVar231 * fVar169) * fVar262 + fVar169 * fVar208;
    fVar231 = (fVar258 * fVar170 + fVar303 * fVar316) * fVar170 + fVar316 * fVar289;
    fVar295 = (fVar258 * fVar259 + fVar303 * fVar167) * fVar259 + fVar167 * fVar244;
    fVar219 = (fVar258 * fVar261 + fVar303 * fVar168) * fVar261 + fVar168 * fVar276;
    fVar258 = (fVar258 * fVar262 + fVar303 * fVar169) * fVar262 + fVar169 * fVar305;
    fVar194 = fVar194 * fVar170 + (fVar287 * fVar170 + fVar161 * fVar316) * fVar316;
    fVar195 = fVar195 * fVar259 + (fVar287 * fVar259 + fVar161 * fVar167) * fVar167;
    fVar206 = fVar206 * fVar261 + (fVar287 * fVar261 + fVar161 * fVar168) * fVar168;
    fVar208 = fVar208 * fVar262 + (fVar287 * fVar262 + fVar161 * fVar169) * fVar169;
    fVar303 = fVar289 * fVar170 + (fVar309 * fVar170 + fVar315 * fVar316) * fVar316;
    fVar289 = fVar244 * fVar259 + (fVar309 * fVar259 + fVar315 * fVar167) * fVar167;
    fVar244 = fVar276 * fVar261 + (fVar309 * fVar261 + fVar315 * fVar168) * fVar168;
    fVar276 = fVar305 * fVar262 + (fVar309 * fVar262 + fVar315 * fVar169) * fVar169;
    local_3d8 = fVar170 * fVar100 + fVar316 * fVar194;
    fStack_3d4 = fVar259 * fVar101 + fVar167 * fVar195;
    fStack_3d0 = fVar261 * fVar120 + fVar168 * fVar206;
    fStack_3cc = fVar262 * fVar141 + fVar169 * fVar208;
    local_3c8 = fVar170 * fVar231 + fVar316 * fVar303;
    fStack_3c4 = fVar259 * fVar295 + fVar167 * fVar289;
    fStack_3c0 = fVar261 * fVar219 + fVar168 * fVar244;
    fStack_3bc = fVar262 * fVar258 + fVar169 * fVar276;
    fVar195 = (fVar195 - fVar101) * 3.0 * fVar99;
    fVar120 = (fVar206 - fVar120) * 3.0 * fVar99;
    fVar141 = (fVar208 - fVar141) * 3.0 * fVar99;
    fVar208 = (fVar289 - fVar295) * 3.0 * fVar99;
    fVar244 = (fVar244 - fVar219) * 3.0 * fVar99;
    fVar258 = (fVar276 - fVar258) * 3.0 * fVar99;
    local_1f8._4_4_ = fStack_3d0;
    local_1f8._0_4_ = fStack_3d4;
    local_1d8._4_4_ = fStack_3c0;
    local_1d8._0_4_ = fStack_3c4;
    fVar206 = local_3d8 + (fVar194 - fVar100) * 3.0 * fVar99;
    fVar295 = fStack_3d4 + fVar195;
    fVar219 = fStack_3d0 + fVar120;
    fVar289 = fStack_3cc + fVar141;
    fVar100 = local_3c8 + (fVar303 - fVar231) * 3.0 * fVar99;
    fVar101 = fStack_3c4 + fVar208;
    fStack_540 = fStack_3c0 + fVar244;
    fStack_53c = fStack_3bc + fVar258;
    local_3b8._0_4_ = fStack_3d4 - fVar195;
    local_3b8._4_4_ = fStack_3d0 - fVar120;
    local_3b8._8_4_ = fStack_3cc - fVar141;
    local_3b8._12_4_ = 0;
    local_1d8._8_4_ = fStack_3bc;
    local_1d8._12_4_ = 0;
    local_1e8._0_4_ = fStack_3c4 - fVar208;
    local_1e8._4_4_ = fStack_3c0 - fVar244;
    local_1e8._8_4_ = fStack_3bc - fVar258;
    local_1e8._12_4_ = 0;
    fVar120 = fVar313 * fVar170 + fVar293 * fVar316;
    fVar141 = fVar313 * fVar259 + fVar293 * fVar167;
    fVar194 = fVar313 * fVar261 + fVar293 * fVar168;
    fVar195 = fVar313 * fVar262 + fVar293 * fVar169;
    fVar208 = fVar290 * fVar170 + fVar165 * fVar316;
    fVar231 = fVar290 * fVar259 + fVar165 * fVar167;
    fVar258 = fVar290 * fVar261 + fVar165 * fVar168;
    fVar315 = fVar290 * fVar262 + fVar165 * fVar169;
    fVar305 = (fVar292 * fVar170 + fVar313 * fVar316) * fVar170 + fVar316 * fVar120;
    fVar287 = (fVar292 * fVar259 + fVar313 * fVar167) * fVar259 + fVar167 * fVar141;
    fVar309 = (fVar292 * fVar261 + fVar313 * fVar168) * fVar261 + fVar168 * fVar194;
    fVar313 = (fVar292 * fVar262 + fVar313 * fVar169) * fVar262 + fVar169 * fVar195;
    fVar276 = (fVar247 * fVar170 + fVar290 * fVar316) * fVar170 + fVar316 * fVar208;
    fVar303 = (fVar247 * fVar259 + fVar290 * fVar167) * fVar259 + fVar167 * fVar231;
    fVar244 = (fVar247 * fVar261 + fVar290 * fVar168) * fVar261 + fVar168 * fVar258;
    fVar247 = (fVar247 * fVar262 + fVar290 * fVar169) * fVar262 + fVar169 * fVar315;
    fVar120 = fVar120 * fVar170 + (fVar293 * fVar170 + fVar277 * fVar316) * fVar316;
    fVar141 = fVar141 * fVar259 + (fVar293 * fVar259 + fVar277 * fVar167) * fVar167;
    fVar194 = fVar194 * fVar261 + (fVar293 * fVar261 + fVar277 * fVar168) * fVar168;
    fVar195 = fVar195 * fVar262 + (fVar293 * fVar262 + fVar277 * fVar169) * fVar169;
    fVar290 = fVar208 * fVar170 + (fVar165 * fVar170 + fVar288 * fVar316) * fVar316;
    fVar293 = fVar231 * fVar259 + (fVar165 * fVar259 + fVar288 * fVar167) * fVar167;
    fVar161 = fVar258 * fVar261 + (fVar165 * fVar261 + fVar288 * fVar168) * fVar168;
    fVar315 = fVar315 * fVar262 + (fVar165 * fVar262 + fVar288 * fVar169) * fVar169;
    fVar208 = fVar170 * fVar305 + fVar316 * fVar120;
    fVar231 = fVar259 * fVar287 + fVar167 * fVar141;
    fVar258 = fVar261 * fVar309 + fVar168 * fVar194;
    fVar292 = fVar262 * fVar313 + fVar169 * fVar195;
    fVar165 = fVar170 * fVar276 + fVar316 * fVar290;
    fVar316 = fVar259 * fVar303 + fVar167 * fVar293;
    fVar167 = fVar261 * fVar244 + fVar168 * fVar161;
    fVar168 = fVar262 * fVar247 + fVar169 * fVar315;
    fVar141 = (fVar141 - fVar287) * 3.0 * fVar99;
    fVar194 = (fVar194 - fVar309) * 3.0 * fVar99;
    fVar195 = (fVar195 - fVar313) * 3.0 * fVar99;
    fVar287 = (fVar293 - fVar303) * 3.0 * fVar99;
    fVar309 = (fVar161 - fVar244) * 3.0 * fVar99;
    fVar313 = (fVar315 - fVar247) * 3.0 * fVar99;
    local_208._4_4_ = fVar258;
    local_208._0_4_ = fVar231;
    local_208._8_4_ = fVar292;
    local_208._12_4_ = 0;
    local_228._4_4_ = fVar167;
    local_228._0_4_ = fVar316;
    local_228._8_4_ = fVar168;
    local_228._12_4_ = 0;
    fVar120 = fVar208 + (fVar120 - fVar305) * 3.0 * fVar99;
    fVar303 = fVar231 + fVar141;
    fVar244 = fVar258 + fVar194;
    fVar247 = fVar292 + fVar195;
    local_218 = fVar165 + (fVar290 - fVar276) * 3.0 * fVar99;
    fStack_214 = fVar316 + fVar287;
    fStack_210 = fVar167 + fVar309;
    fStack_20c = fVar168 + fVar313;
    local_248._0_4_ = fVar231 - fVar141;
    local_248._4_4_ = fVar258 - fVar194;
    local_248._8_4_ = fVar292 - fVar195;
    local_248._12_4_ = 0;
    local_238._0_4_ = fVar316 - fVar287;
    local_238._4_4_ = fVar167 - fVar309;
    local_238._8_4_ = fVar168 - fVar313;
    local_238._12_4_ = 0;
    local_1f8._8_4_ = fStack_3cc;
    local_1f8._12_4_ = 0;
    fVar276 = (fVar231 - fStack_3d4) + (fVar208 - local_3d8);
    fVar305 = (fVar258 - fStack_3d0) + (fVar231 - fStack_3d4);
    fVar287 = (fVar292 - fStack_3cc) + (fVar258 - fStack_3d0);
    fVar309 = (fVar292 - fStack_3cc) + 0.0;
    fVar99 = (fVar316 - fStack_3c4) + (fVar165 - local_3c8);
    fVar141 = (fVar167 - fStack_3c0) + (fVar316 - fStack_3c4);
    fVar194 = (fVar168 - fStack_3bc) + (fVar167 - fStack_3c0);
    fVar195 = (fVar168 - fStack_3bc) + 0.0;
    auVar188._0_8_ =
         CONCAT44(fStack_3c4 * fVar305 - fStack_3d4 * fVar141,
                  local_3c8 * fVar276 - local_3d8 * fVar99);
    auVar188._8_4_ = fStack_3c0 * fVar287 - fStack_3d0 * fVar194;
    auVar188._12_4_ = fStack_3bc * fVar309 - fStack_3cc * fVar195;
    auVar131._0_4_ = fVar100 * fVar276 - fVar206 * fVar99;
    auVar131._4_4_ = fVar101 * fVar305 - fVar295 * fVar141;
    auVar131._8_4_ = fStack_540 * fVar287 - fVar219 * fVar194;
    auVar131._12_4_ = fStack_53c * fVar309 - fVar289 * fVar195;
    auVar148._0_8_ =
         CONCAT44(local_1e8._4_4_ * fVar305 - fVar141 * local_3b8._4_4_,
                  local_1e8._0_4_ * fVar276 - fVar99 * local_3b8._0_4_);
    auVar148._8_4_ = local_1e8._8_4_ * fVar287 - fVar194 * local_3b8._8_4_;
    auVar148._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
    auVar322._0_4_ = fVar276 * fStack_3c4 - fVar99 * fStack_3d4;
    auVar322._4_4_ = fVar305 * fStack_3c0 - fVar141 * fStack_3d0;
    auVar322._8_4_ = fVar287 * fStack_3bc - fVar194 * fStack_3cc;
    auVar322._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
    auVar92._0_8_ =
         CONCAT44(fVar316 * fVar305 - fVar231 * fVar141,fVar165 * fVar276 - fVar208 * fVar99);
    auVar92._8_4_ = fVar167 * fVar287 - fVar258 * fVar194;
    auVar92._12_4_ = fVar168 * fVar309 - fVar292 * fVar195;
    auVar269._0_4_ = local_218 * fVar276 - fVar120 * fVar99;
    auVar269._4_4_ = fStack_214 * fVar305 - fVar303 * fVar141;
    auVar269._8_4_ = fStack_210 * fVar287 - fVar244 * fVar194;
    auVar269._12_4_ = fStack_20c * fVar309 - fVar247 * fVar195;
    auVar220._0_8_ =
         CONCAT44(local_238._4_4_ * fVar305 - fVar141 * local_248._4_4_,
                  local_238._0_4_ * fVar276 - fVar99 * local_248._0_4_);
    auVar220._8_4_ = local_238._8_4_ * fVar287 - fVar194 * local_248._8_4_;
    auVar220._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
    auVar254._0_4_ = fVar276 * fVar316 - fVar99 * fVar231;
    auVar254._4_4_ = fVar305 * fVar167 - fVar141 * fVar258;
    auVar254._8_4_ = fVar287 * fVar168 - fVar194 * fVar292;
    auVar254._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
    auVar317._8_4_ = auVar188._8_4_;
    auVar317._0_8_ = auVar188._0_8_;
    auVar317._12_4_ = auVar188._12_4_;
    auVar236 = minps(auVar317,auVar131);
    auVar124 = maxps(auVar188,auVar131);
    auVar132._8_4_ = auVar148._8_4_;
    auVar132._0_8_ = auVar148._0_8_;
    auVar132._12_4_ = auVar148._12_4_;
    auVar70 = minps(auVar132,auVar322);
    auVar318 = minps(auVar236,auVar70);
    auVar70 = maxps(auVar148,auVar322);
    auVar126 = maxps(auVar124,auVar70);
    auVar133._8_4_ = auVar92._8_4_;
    auVar133._0_8_ = auVar92._0_8_;
    auVar133._12_4_ = auVar92._12_4_;
    auVar124 = minps(auVar133,auVar269);
    auVar70 = maxps(auVar92,auVar269);
    auVar149._8_4_ = auVar220._8_4_;
    auVar149._0_8_ = auVar220._0_8_;
    auVar149._12_4_ = auVar220._12_4_;
    auVar236 = minps(auVar149,auVar254);
    auVar124 = minps(auVar124,auVar236);
    auVar236 = minps(auVar318,auVar124);
    auVar124 = maxps(auVar220,auVar254);
    auVar70 = maxps(auVar70,auVar124);
    auVar70 = maxps(auVar126,auVar70);
    auVar189._0_4_ =
         -(uint)(local_268 <= auVar70._0_4_ && auVar236._0_4_ <= local_258) & local_278._0_4_;
    auVar189._4_4_ =
         -(uint)(fStack_264 <= auVar70._4_4_ && auVar236._4_4_ <= fStack_254) & local_278._4_4_;
    auVar189._8_4_ =
         -(uint)(fStack_260 <= auVar70._8_4_ && auVar236._8_4_ <= fStack_250) & local_278._8_4_;
    auVar189._12_4_ =
         -(uint)(fStack_25c <= auVar70._12_4_ && auVar236._12_4_ <= fStack_24c) & local_278._12_4_;
    iVar57 = movmskps((int)uVar58,auVar189);
    uVar53 = 0;
    if (iVar57 != 0) {
      fVar276 = (fVar231 - fVar208) + (fStack_3d4 - local_3d8);
      fVar305 = (fVar258 - fVar231) + (fStack_3d0 - fStack_3d4);
      fVar287 = (fVar292 - fVar258) + (fStack_3cc - fStack_3d0);
      fVar309 = (0.0 - fVar292) + (0.0 - fStack_3cc);
      fVar99 = (fVar316 - fVar165) + (fStack_3c4 - local_3c8);
      fVar141 = (fVar167 - fVar316) + (fStack_3c0 - fStack_3c4);
      fVar194 = (fVar168 - fVar167) + (fStack_3bc - fStack_3c0);
      fVar195 = (0.0 - fVar168) + (0.0 - fStack_3bc);
      auVar323._0_8_ =
           CONCAT44(fStack_3c4 * fVar305 - fStack_3d4 * fVar141,
                    local_3c8 * fVar276 - local_3d8 * fVar99);
      auVar323._8_4_ = fStack_3c0 * fVar287 - fStack_3d0 * fVar194;
      auVar323._12_4_ = fStack_3bc * fVar309 - fStack_3cc * fVar195;
      auVar134._0_4_ = fVar100 * fVar276 - fVar206 * fVar99;
      auVar134._4_4_ = fVar101 * fVar305 - fVar295 * fVar141;
      auVar134._8_4_ = fStack_540 * fVar287 - fVar219 * fVar194;
      auVar134._12_4_ = fStack_53c * fVar309 - fVar289 * fVar195;
      auVar214._0_8_ =
           CONCAT44(local_1e8._4_4_ * fVar305 - local_3b8._4_4_ * fVar141,
                    local_1e8._0_4_ * fVar276 - local_3b8._0_4_ * fVar99);
      auVar214._8_4_ = local_1e8._8_4_ * fVar287 - local_3b8._8_4_ * fVar194;
      auVar214._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
      auVar150._0_4_ = fStack_3c4 * fVar276 - fStack_3d4 * fVar99;
      auVar150._4_4_ = fStack_3c0 * fVar305 - fStack_3d0 * fVar141;
      auVar150._8_4_ = fStack_3bc * fVar287 - fStack_3cc * fVar194;
      auVar150._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
      auVar300._0_8_ =
           CONCAT44(fVar316 * fVar305 - fVar231 * fVar141,fVar165 * fVar276 - fVar208 * fVar99);
      auVar300._8_4_ = fVar167 * fVar287 - fVar258 * fVar194;
      auVar300._12_4_ = fVar168 * fVar309 - fVar292 * fVar195;
      auVar162._0_4_ = local_218 * fVar276 - fVar120 * fVar99;
      auVar162._4_4_ = fStack_214 * fVar305 - fVar303 * fVar141;
      auVar162._8_4_ = fStack_210 * fVar287 - fVar244 * fVar194;
      auVar162._12_4_ = fStack_20c * fVar309 - fVar247 * fVar195;
      auVar270._0_8_ =
           CONCAT44(local_238._4_4_ * fVar305 - local_248._4_4_ * fVar141,
                    local_238._0_4_ * fVar276 - local_248._0_4_ * fVar99);
      auVar270._8_4_ = local_238._8_4_ * fVar287 - local_248._8_4_ * fVar194;
      auVar270._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
      auVar255._0_4_ = fVar276 * fVar316 - fVar99 * fVar231;
      auVar255._4_4_ = fVar305 * fVar167 - fVar141 * fVar258;
      auVar255._8_4_ = fVar287 * fVar168 - fVar194 * fVar292;
      auVar255._12_4_ = fVar309 * 0.0 - fVar195 * 0.0;
      auVar93._8_4_ = auVar323._8_4_;
      auVar93._0_8_ = auVar323._0_8_;
      auVar93._12_4_ = auVar323._12_4_;
      auVar70 = minps(auVar93,auVar134);
      auVar236 = maxps(auVar323,auVar134);
      auVar135._8_4_ = auVar214._8_4_;
      auVar135._0_8_ = auVar214._0_8_;
      auVar135._12_4_ = auVar214._12_4_;
      auVar124 = minps(auVar135,auVar150);
      auVar70 = minps(auVar70,auVar124);
      auVar124 = maxps(auVar214,auVar150);
      auVar318 = maxps(auVar236,auVar124);
      auVar136._8_4_ = auVar300._8_4_;
      auVar136._0_8_ = auVar300._0_8_;
      auVar136._12_4_ = auVar300._12_4_;
      auVar124 = minps(auVar136,auVar162);
      auVar126 = maxps(auVar300,auVar162);
      auVar151._8_4_ = auVar270._8_4_;
      auVar151._0_8_ = auVar270._0_8_;
      auVar151._12_4_ = auVar270._12_4_;
      auVar236 = minps(auVar151,auVar255);
      auVar124 = minps(auVar124,auVar236);
      auVar70 = minps(auVar70,auVar124);
      auVar124 = maxps(auVar270,auVar255);
      auVar124 = maxps(auVar126,auVar124);
      auVar124 = maxps(auVar318,auVar124);
      auVar324._0_4_ =
           -(uint)(local_268 <= auVar124._0_4_ && auVar70._0_4_ <= local_258) & auVar189._0_4_;
      auVar324._4_4_ =
           -(uint)(fStack_264 <= auVar124._4_4_ && auVar70._4_4_ <= fStack_254) & auVar189._4_4_;
      auVar324._8_4_ =
           -(uint)(fStack_260 <= auVar124._8_4_ && auVar70._8_4_ <= fStack_250) & auVar189._8_4_;
      auVar324._12_4_ =
           -(uint)(fStack_25c <= auVar124._12_4_ && auVar70._12_4_ <= fStack_24c) & auVar189._12_4_;
      uVar66 = movmskps(0,auVar324);
      uVar53 = (ulong)uVar66;
    }
    if ((uint)uVar53 != 0) {
      auStack_338[uVar52] = (uint)uVar53;
      *(undefined8 *)(afStack_108 + uVar52 * 2) = local_528;
      auStack_58[uVar52] = local_538;
      uVar52 = (ulong)((int)uVar52 + 1);
    }
    do {
      if ((int)uVar52 == 0) {
        if (local_54c != 0) {
          return local_54d;
        }
        fVar140 = *(float *)(ray + k * 4 + 0x80);
        auVar119._4_4_ = -(uint)(fStack_294 <= fVar140);
        auVar119._0_4_ = -(uint)(local_298 <= fVar140);
        auVar119._8_4_ = -(uint)(fStack_290 <= fVar140);
        auVar119._12_4_ = -(uint)(fStack_28c <= fVar140);
        uVar64 = movmskps((int)uVar53,auVar119);
        uVar63 = uVar63 & (uint)local_3e0 & uVar64;
        local_54d = uVar63 != 0;
        if (!local_54d) {
          return local_54d;
        }
        goto LAB_00c39f15;
      }
      uVar67 = (int)uVar52 - 1;
      uVar54 = (ulong)uVar67;
      uVar66 = auStack_338[uVar54];
      local_538 = auStack_58[uVar54];
      uVar53 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> uVar53 & 1) == 0; uVar53 = uVar53 + 1) {
        }
      }
      uVar66 = uVar66 - 1 & uVar66;
      auStack_338[uVar54] = uVar66;
      if (uVar66 == 0) {
        uVar52 = (ulong)uVar67;
      }
      uVar59 = uVar53 + 1;
      uVar58 = uVar59;
      if ((long)uVar59 < 0) {
        uVar58 = (ulong)((uint)uVar59 & 1) | uVar59 >> 1;
      }
      fVar99 = afStack_108[uVar54 * 2];
      fVar100 = afStack_108[uVar54 * 2 + 1];
      fVar101 = fVar99 * (1.0 - (float)uVar53 * 0.33333334) + fVar100 * (float)uVar53 * 0.33333334;
      fVar120 = fVar99 * (1.0 - (float)uVar59 * 0.33333334) + fVar100 * (float)uVar59 * 0.33333334;
      fVar141 = fVar99 * 0.0 + fVar100 * 0.0;
      fVar100 = fVar99 * 0.0 + fVar100 * 0.0;
      fVar99 = fVar120 - fVar101;
      local_528 = CONCAT44(fVar120,fVar101);
      if (0.16666667 <= fVar99) break;
      fVar194 = (float)local_538;
      fVar195 = (float)((ulong)local_538 >> 0x20);
      fVar206 = 1.0 - fVar194;
      fVar208 = 1.0 - fVar194;
      fVar231 = 1.0 - fVar195;
      fVar295 = 1.0 - fVar195;
      fVar303 = fVar196 * fVar206 + (float)local_378 * fVar194;
      fVar244 = fVar207 * fVar208 + local_378._4_4_ * fVar194;
      fVar247 = fVar196 * fVar231 + (float)uStack_370 * fVar195;
      fVar276 = fVar207 * fVar295 + uStack_370._4_4_ * fVar195;
      fVar290 = (float)local_348 * fVar206 + (float)local_388 * fVar194;
      fVar293 = local_348._4_4_ * fVar208 + local_388._4_4_ * fVar194;
      fVar161 = (float)uStack_340 * fVar231 + (float)uStack_380 * fVar195;
      fVar315 = uStack_340._4_4_ * fVar295 + uStack_380._4_4_ * fVar195;
      fVar165 = (float)local_358 * fVar206 + (float)local_398 * fVar194;
      fVar167 = local_358._4_4_ * fVar208 + local_398._4_4_ * fVar194;
      fVar169 = (float)uStack_350 * fVar231 + (float)uStack_390 * fVar195;
      fVar259 = uStack_350._4_4_ * fVar295 + uStack_390._4_4_ * fVar195;
      fVar305 = (fVar206 * (float)local_368 + fVar194 * (float)local_3a8) - fVar165;
      fVar287 = (fVar208 * local_368._4_4_ + fVar194 * local_3a8._4_4_) - fVar167;
      fVar309 = (fVar231 * (float)uStack_360 + fVar195 * (float)uStack_3a0) - fVar169;
      fVar313 = (fVar295 * uStack_360._4_4_ + fVar195 * uStack_3a0._4_4_) - fVar259;
      fVar194 = fVar101 * (fVar165 - fVar290) + fVar290;
      fVar195 = fVar101 * (fVar167 - fVar293) + fVar293;
      fVar206 = fVar101 * (fVar169 - fVar161) + fVar161;
      fVar208 = fVar101 * (fVar259 - fVar315) + fVar315;
      fVar316 = (fVar165 - fVar290) * fVar120 + fVar290;
      fVar168 = (fVar167 - fVar293) * fVar120 + fVar293;
      fVar170 = (fVar169 - fVar161) * fVar120 + fVar161;
      fVar261 = (fVar259 - fVar315) * fVar120 + fVar315;
      fVar231 = fVar101 * (fVar290 - fVar303) + fVar303;
      fVar295 = fVar101 * (fVar293 - fVar244) + fVar244;
      fVar258 = fVar101 * (fVar161 - fVar247) + fVar247;
      fVar292 = fVar101 * (fVar315 - fVar276) + fVar276;
      fVar231 = (fVar194 - fVar231) * fVar101 + fVar231;
      fVar295 = (fVar195 - fVar295) * fVar101 + fVar295;
      fVar258 = (fVar206 - fVar258) * fVar101 + fVar258;
      fVar292 = (fVar208 - fVar292) * fVar101 + fVar292;
      fVar194 = (((fVar101 * fVar305 + fVar165) - fVar194) * fVar101 + fVar194) - fVar231;
      fVar195 = (((fVar101 * fVar287 + fVar167) - fVar195) * fVar101 + fVar195) - fVar295;
      fVar206 = (((fVar101 * fVar309 + fVar169) - fVar206) * fVar101 + fVar206) - fVar258;
      fVar208 = (((fVar101 * fVar313 + fVar259) - fVar208) * fVar101 + fVar208) - fVar292;
      fVar231 = fVar101 * fVar194 + fVar231;
      fVar295 = fVar101 * fVar195 + fVar295;
      fVar258 = fVar101 * fVar206 + fVar258;
      fVar292 = fVar101 * fVar208 + fVar292;
      fVar303 = (fVar290 - fVar303) * fVar120 + fVar303;
      fVar244 = (fVar293 - fVar244) * fVar120 + fVar244;
      fVar247 = (fVar161 - fVar247) * fVar120 + fVar247;
      fVar276 = (fVar315 - fVar276) * fVar120 + fVar276;
      fVar303 = (fVar316 - fVar303) * fVar120 + fVar303;
      fVar244 = (fVar168 - fVar244) * fVar120 + fVar244;
      fVar247 = (fVar170 - fVar247) * fVar120 + fVar247;
      fVar276 = (fVar261 - fVar276) * fVar120 + fVar276;
      fVar290 = (((fVar305 * fVar120 + fVar165) - fVar316) * fVar120 + fVar316) - fVar303;
      fVar293 = (((fVar287 * fVar120 + fVar167) - fVar168) * fVar120 + fVar168) - fVar244;
      fVar161 = (((fVar309 * fVar120 + fVar169) - fVar170) * fVar120 + fVar170) - fVar247;
      fVar315 = (((fVar313 * fVar120 + fVar259) - fVar261) * fVar120 + fVar261) - fVar276;
      fVar303 = fVar120 * fVar290 + fVar303;
      fVar244 = fVar120 * fVar293 + fVar244;
      fVar247 = fVar120 * fVar161 + fVar247;
      fVar276 = fVar120 * fVar315 + fVar276;
      fVar165 = fVar99 * 0.33333334;
      fVar305 = fVar194 * 3.0 * fVar165 + fVar231;
      fVar287 = fVar195 * 3.0 * fVar165 + fVar295;
      fVar309 = fVar206 * 3.0 * fVar165 + fVar258;
      fVar313 = fVar208 * 3.0 * fVar165 + fVar292;
      fVar290 = fVar303 - fVar165 * fVar290 * 3.0;
      fVar293 = fVar244 - fVar165 * fVar293 * 3.0;
      fVar161 = fVar247 - fVar165 * fVar161 * 3.0;
      fVar315 = fVar276 - fVar165 * fVar315 * 3.0;
      local_538 = CONCAT44(fVar292,fVar258);
      fVar168 = (fVar247 - fVar303) + (fVar258 - fVar231);
      fVar169 = (fVar276 - fVar244) + (fVar292 - fVar295);
      auVar221._0_4_ = fVar169 * fVar244;
      auVar221._4_4_ = fVar169 * fVar244;
      auVar221._8_4_ = fVar169 * fVar276;
      auVar221._12_4_ = fVar169 * fVar276;
      fVar194 = fVar231 * fVar168 + fVar295 * fVar169;
      fVar195 = fVar258 * fVar168 + fVar292 * fVar169;
      fVar170 = fVar305 * fVar168 + fVar287 * fVar169;
      fVar259 = fVar309 * fVar168 + fVar313 * fVar169;
      fVar165 = fVar290 * fVar168 + fVar293 * fVar169;
      auVar237._4_4_ = fVar293 * fVar168 + fVar293 * fVar169;
      auVar237._0_4_ = fVar165;
      fVar316 = fVar161 * fVar168 + fVar315 * fVar169;
      fVar206 = fVar168 * fVar303 + auVar221._0_4_;
      fVar167 = fVar168 * fVar247 + auVar221._8_4_;
      auVar20._4_8_ = auVar221._8_8_;
      auVar20._0_4_ = fVar287 * fVar168 + fVar287 * fVar169;
      auVar222._0_8_ = auVar20._0_8_ << 0x20;
      auVar222._8_4_ = fVar259;
      auVar222._12_4_ = fVar313 * fVar168 + fVar313 * fVar169;
      fVar208 = fVar170;
      if (fVar170 <= fVar194) {
        fVar208 = fVar194;
        fVar194 = fVar170;
      }
      auVar223._8_8_ = auVar222._8_8_;
      auVar223._0_8_ = auVar223._8_8_;
      auVar237._8_4_ = fVar316;
      auVar237._12_4_ = fVar315 * fVar168 + fVar315 * fVar169;
      if (fVar206 <= fVar165) {
        auVar237._0_4_ = fVar206;
      }
      if (auVar237._0_4_ <= fVar194) {
        fVar194 = auVar237._0_4_;
      }
      auVar21._4_8_ = auVar237._8_8_;
      auVar21._0_4_ = fVar168 * fVar244 + auVar221._4_4_;
      auVar238._0_8_ = auVar21._0_8_ << 0x20;
      auVar238._8_4_ = fVar167;
      auVar238._12_4_ = fVar168 * fVar276 + auVar221._12_4_;
      if (fVar206 <= fVar165) {
        fVar206 = fVar165;
      }
      auVar239._8_8_ = auVar238._8_8_;
      auVar239._0_8_ = auVar239._8_8_;
      if (fVar206 <= fVar208) {
        fVar206 = fVar208;
      }
      if (fVar259 <= fVar195) {
        auVar223._0_4_ = fVar195;
        fVar195 = fVar259;
      }
      fVar208 = fVar316;
      if (fVar167 <= fVar316) {
        fVar208 = fVar167;
      }
      if (fVar208 <= fVar195) {
        fVar195 = fVar208;
      }
      if (fVar167 <= fVar316) {
        auVar239._0_4_ = fVar316;
      }
      if (auVar239._0_4_ <= auVar223._0_4_) {
        auVar239._0_4_ = auVar223._0_4_;
      }
      uVar58 = CONCAT71((int7)(uVar58 >> 8),fVar99 < 0.001);
      bVar62 = 3 < (uint)uVar52;
      uVar22 = (undefined3)(uVar67 >> 8);
      uVar53 = (ulong)CONCAT31(uVar22,bVar62);
      fVar208 = auVar239._0_4_;
      if ((0.0001 <= fVar194) || (fVar208 <= -0.0001)) {
        if ((-0.0001 < fVar206 && fVar195 < 0.0001) ||
           ((fVar194 < 0.0001 && -0.0001 < fVar206 || (fVar195 < 0.0001 && -0.0001 < fVar208))))
        goto LAB_00c3b77f;
        bVar25 = true;
      }
      else {
LAB_00c3b77f:
        bVar62 = bVar62 || fVar99 < 0.001;
        uVar53 = (ulong)CONCAT31(uVar22,bVar62);
        fVar167 = (float)(~-(uint)(fVar194 < 0.0) & 0x3f800000 | -(uint)(fVar194 < 0.0) & 0xbf800000
                         );
        fVar316 = (float)(~-(uint)(fVar206 < 0.0) & 0x3f800000 | -(uint)(fVar206 < 0.0) & 0xbf800000
                         );
        fVar165 = 0.0;
        if ((fVar167 == fVar316) && (!NAN(fVar167) && !NAN(fVar316))) {
          fVar165 = INFINITY;
        }
        fVar168 = 0.0;
        if ((fVar167 == fVar316) && (!NAN(fVar167) && !NAN(fVar316))) {
          fVar168 = -INFINITY;
        }
        fVar169 = (float)(~-(uint)(fVar195 < 0.0) & 0x3f800000 | -(uint)(fVar195 < 0.0) & 0xbf800000
                         );
        if ((fVar167 != fVar169) || (fVar170 = fVar168, NAN(fVar167) || NAN(fVar169))) {
          if ((fVar195 != fVar194) || (NAN(fVar195) || NAN(fVar194))) {
            fVar195 = -fVar194 / (fVar195 - fVar194);
            fVar195 = (1.0 - fVar195) * 0.0 + fVar195;
            fVar170 = fVar195;
          }
          else {
            fVar195 = INFINITY;
            if ((fVar194 == 0.0) && (fVar195 = INFINITY, !NAN(fVar194))) {
              fVar195 = 0.0;
            }
            fVar170 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar194 == 0.0) & 1) * 4);
          }
          if (fVar195 <= fVar165) {
            fVar165 = fVar195;
          }
          if (fVar170 <= fVar168) {
            fVar170 = fVar168;
          }
        }
        uVar58 = (ulong)(fVar208 < 0.0);
        fVar194 = *(float *)(&DAT_01ff1ecc + uVar58 * 4);
        if ((fVar316 != fVar194) || (fVar195 = fVar170, NAN(fVar316) || NAN(fVar194))) {
          if ((fVar208 != fVar206) || (NAN(fVar208) || NAN(fVar206))) {
            fVar208 = -fVar206 / (fVar208 - fVar206);
            fVar208 = (1.0 - fVar208) * 0.0 + fVar208;
            fVar195 = fVar208;
          }
          else {
            fVar208 = INFINITY;
            if ((fVar206 == 0.0) && (fVar208 = INFINITY, !NAN(fVar206))) {
              fVar208 = 0.0;
            }
            uVar58 = (ulong)(-(uint)(fVar206 == 0.0) & 1);
            fVar195 = *(float *)(&DAT_01ff1ec4 + uVar58 * 4);
          }
          if (fVar208 <= fVar165) {
            fVar165 = fVar208;
          }
          if (fVar195 <= fVar170) {
            fVar195 = fVar170;
          }
        }
        if ((fVar169 != fVar194) || (NAN(fVar169) || NAN(fVar194))) {
          fVar165 = (float)(~-(uint)(fVar165 < 1.0) & 0x3f800000 |
                           (uint)fVar165 & -(uint)(fVar165 < 1.0));
          fVar195 = (float)(~-(uint)(fVar195 < 1.0) & (uint)fVar195 |
                           -(uint)(fVar195 < 1.0) & 0x3f800000);
        }
        fVar165 = (float)(~-(uint)(fVar165 < 0.0) & (uint)fVar165);
        fVar194 = (float)(~-(uint)(fVar195 < 1.0) & 0x3f800000 |
                         (uint)fVar195 & -(uint)(fVar195 < 1.0));
        bVar25 = true;
        if (fVar165 <= fVar194) {
          fVar165 = fVar165 + -0.1;
          fVar194 = fVar194 + 0.1;
          uVar66 = -(uint)(fVar194 < 1.0);
          fVar165 = (float)(~-(uint)(fVar165 < 0.0) & (uint)fVar165);
          fVar170 = (float)(~uVar66 & 0x3f800000 | (uint)fVar194 & uVar66);
          fVar316 = 1.0 - fVar165;
          fVar167 = 1.0 - fVar165;
          fVar168 = 1.0 - fVar170;
          fVar169 = 1.0 - fVar170;
          fVar194 = fVar231 * fVar316 + fVar258 * fVar165;
          fVar195 = fVar295 * fVar167 + fVar292 * fVar165;
          fVar206 = fVar231 * fVar168 + fStack_540 * fVar170;
          fVar208 = fVar295 * fVar169 + fStack_53c * fVar170;
          fVar231 = fVar305 * fVar316 + fVar309 * fVar165;
          fVar295 = fVar287 * fVar167 + fVar313 * fVar165;
          fVar305 = fVar305 * fVar168 + fVar309 * fVar170;
          fVar287 = fVar287 * fVar169 + fVar313 * fVar170;
          fVar309 = fVar290 * fVar316 + fVar161 * fVar165;
          fVar313 = fVar293 * fVar167 + fVar315 * fVar165;
          fVar290 = fVar290 * fVar168 + fVar161 * fVar170;
          fVar293 = fVar293 * fVar169 + fVar315 * fVar170;
          fVar161 = fVar316 * fVar303 + fVar247 * fVar165;
          fVar315 = fVar167 * fVar244 + fVar276 * fVar165;
          fVar303 = fVar168 * fVar303 + fVar219 * fVar170;
          fVar244 = fVar169 * fVar244 + fVar289 * fVar170;
          fVar304 = fVar258 * (1.0 - fVar165) + fVar292 * fVar165;
          fStack_53c = fVar258 * (1.0 - fVar170) + fVar292 * fVar170;
          fVar99 = 1.0 / fVar99;
          auVar116._0_4_ = fVar303 - fVar161;
          auVar116._4_4_ = fVar244 - fVar315;
          auVar116._8_4_ = fVar303 - fVar303;
          auVar116._12_4_ = fVar244 - fVar244;
          auVar152._0_8_ = CONCAT44(fVar293 - fVar313,fVar290 - fVar309);
          auVar152._8_4_ = fVar290 - fVar290;
          auVar152._12_4_ = fVar293 - fVar293;
          auVar256._0_4_ = fVar305 - fVar231;
          auVar256._4_4_ = fVar287 - fVar295;
          auVar256._8_4_ = fVar305 - fVar305;
          auVar256._12_4_ = fVar287 - fVar287;
          auVar215._0_8_ = CONCAT44((fVar295 - fVar195) * 3.0,(fVar231 - fVar194) * 3.0);
          auVar215._8_4_ = (fVar305 - fVar206) * 3.0;
          auVar215._12_4_ = (fVar287 - fVar208) * 3.0;
          auVar190._0_8_ = CONCAT44((fVar313 - fVar295) * 3.0,(fVar309 - fVar231) * 3.0);
          auVar190._8_4_ = (fVar290 - fVar305) * 3.0;
          auVar190._12_4_ = (fVar293 - fVar287) * 3.0;
          auVar240._0_4_ = (fVar161 - fVar309) * 3.0;
          auVar240._4_4_ = (fVar315 - fVar313) * 3.0;
          auVar240._8_4_ = (fVar303 - fVar290) * 3.0;
          auVar240._12_4_ = (fVar244 - fVar293) * 3.0;
          auVar198._8_4_ = auVar190._8_4_;
          auVar198._0_8_ = auVar190._0_8_;
          auVar198._12_4_ = auVar190._12_4_;
          auVar124 = minps(auVar198,auVar240);
          auVar70 = maxps(auVar190,auVar240);
          auVar224._8_4_ = auVar215._8_4_;
          auVar224._0_8_ = auVar215._0_8_;
          auVar224._12_4_ = auVar215._12_4_;
          auVar126 = minps(auVar224,auVar124);
          auVar236 = maxps(auVar215,auVar70);
          auVar23._4_8_ = auVar70._8_8_;
          auVar23._0_4_ = auVar126._4_4_;
          auVar191._0_8_ = auVar23._0_8_ << 0x20;
          auVar191._8_4_ = auVar126._8_4_;
          auVar191._12_4_ = auVar126._12_4_;
          auVar192._8_8_ = auVar126._8_8_;
          auVar192._0_8_ = auVar191._8_8_;
          auVar24._4_8_ = auVar124._8_8_;
          auVar24._0_4_ = auVar236._4_4_;
          auVar199._0_8_ = auVar24._0_8_ << 0x20;
          auVar199._8_4_ = auVar236._8_4_;
          auVar199._12_4_ = auVar236._12_4_;
          auVar200._8_8_ = auVar236._8_8_;
          auVar200._0_8_ = auVar199._8_8_;
          auVar124 = minps(auVar126,auVar192);
          auVar70 = maxps(auVar236,auVar200);
          fVar170 = auVar124._0_4_ * fVar99;
          fVar259 = auVar124._4_4_ * fVar99;
          fVar261 = auVar124._8_4_ * fVar99;
          fVar262 = auVar124._12_4_ * fVar99;
          fVar309 = fVar99 * auVar70._0_4_;
          fVar290 = fVar99 * auVar70._4_4_;
          fVar161 = fVar99 * auVar70._8_4_;
          fVar99 = fVar99 * auVar70._12_4_;
          fVar168 = 1.0 / (fStack_53c - fVar304);
          auVar137._0_8_ = CONCAT44(fVar208 - fVar195,fVar206 - fVar194);
          auVar137._8_4_ = fVar206 - fVar206;
          auVar137._12_4_ = fVar208 - fVar208;
          auVar201._8_4_ = auVar137._8_4_;
          auVar201._0_8_ = auVar137._0_8_;
          auVar201._12_4_ = auVar137._12_4_;
          auVar236 = minps(auVar201,auVar256);
          auVar124 = maxps(auVar137,auVar256);
          auVar94._8_4_ = auVar152._8_4_;
          auVar94._0_8_ = auVar152._0_8_;
          auVar94._12_4_ = auVar152._12_4_;
          auVar70 = minps(auVar94,auVar116);
          auVar236 = minps(auVar236,auVar70);
          auVar70 = maxps(auVar152,auVar116);
          auVar70 = maxps(auVar124,auVar70);
          fVar316 = auVar236._0_4_ * fVar168;
          fVar167 = auVar236._4_4_ * fVar168;
          fVar169 = fVar168 * auVar70._0_4_;
          fVar168 = fVar168 * auVar70._4_4_;
          local_538 = CONCAT44(fStack_53c,fVar304);
          auVar193._4_4_ = fStack_53c;
          auVar193._0_4_ = fVar120;
          auVar193._8_4_ = fVar141;
          auVar193._12_4_ = fVar100;
          fVar194 = (fVar101 + fVar120) * 0.5;
          fVar195 = (fVar304 + fStack_53c) * 0.5;
          fVar206 = (fVar120 + fVar141) * 0.0;
          fVar208 = (fStack_53c + fVar100) * 0.0;
          fVar231 = local_118 * fVar194 + fVar196;
          fVar258 = fStack_114 * fVar194 + fVar207;
          fVar295 = fStack_110 * fVar194 + fVar260;
          fVar292 = fStack_10c * fVar194 + fVar263;
          fVar303 = local_128 * fVar194 + fVar217;
          fVar244 = fStack_124 * fVar194 + fVar218;
          fVar305 = fStack_120 * fVar194 + fVar272;
          fVar287 = fStack_11c * fVar194 + fVar273;
          fVar231 = (fVar303 - fVar231) * fVar194 + fVar231;
          fVar258 = (fVar244 - fVar258) * fVar194 + fVar258;
          fVar295 = (fVar305 - fVar295) * fVar194 + fVar295;
          fVar292 = (fVar287 - fVar292) * fVar194 + fVar292;
          fVar303 = (((local_138 * fVar194 + fVar247) - fVar303) * fVar194 + fVar303) - fVar231;
          fVar244 = (((fStack_134 * fVar194 + fVar276) - fVar244) * fVar194 + fVar244) - fVar258;
          fVar305 = (((fStack_130 * fVar194 + fVar274) - fVar305) * fVar194 + fVar305) - fVar295;
          fVar287 = (((fStack_12c * fVar194 + fVar286) - fVar287) * fVar194 + fVar287) - fVar292;
          fVar231 = fVar194 * fVar303 + fVar231;
          fVar258 = fVar194 * fVar244 + fVar258;
          fVar303 = fVar303 * 3.0;
          fVar244 = fVar244 * 3.0;
          fVar295 = (fVar194 * fVar305 + fVar295) - fVar231;
          fVar292 = (fVar194 * fVar287 + fVar292) - fVar258;
          fVar303 = (fVar305 * 3.0 - fVar303) * fVar195 + fVar303;
          fVar244 = (fVar287 * 3.0 - fVar244) * fVar195 + fVar244;
          auVar117._0_8_ = CONCAT44(fVar303,fVar295) ^ 0x80000000;
          auVar117._8_4_ = fVar303;
          auVar117._12_4_ = fVar303;
          fVar277 = fVar101 - fVar194;
          fVar288 = fVar304 - fVar195;
          fVar291 = fVar120 - fVar206;
          fVar294 = fStack_53c - fVar208;
          fVar297 = fVar120 - fVar194;
          fVar299 = fStack_53c - fVar195;
          fVar141 = fVar141 - fVar206;
          fVar100 = fVar100 - fVar208;
          fVar231 = fVar295 * fVar195 + fVar231;
          fVar258 = fVar292 * fVar195 + fVar258;
          auVar138._0_8_ = CONCAT44(fVar244,fVar292) ^ 0x8000000000000000;
          auVar138._8_4_ = -fVar244;
          auVar138._12_4_ = -fVar244;
          auVar283._0_4_ = fVar292 * fVar303 - fVar244 * fVar295;
          auVar283._4_4_ = auVar283._0_4_;
          auVar283._8_4_ = auVar283._0_4_;
          auVar283._12_4_ = auVar283._0_4_;
          auVar124 = divps(auVar138,auVar283);
          auVar70 = divps(auVar117,auVar283);
          fVar303 = auVar124._0_4_;
          fVar244 = auVar124._4_4_;
          fVar295 = auVar70._0_4_;
          fVar292 = auVar70._4_4_;
          fVar194 = fVar194 - (fVar258 * fVar295 + fVar231 * fVar303);
          fVar206 = fVar195 - (fVar258 * fVar292 + fVar231 * fVar244);
          fVar208 = fVar195 - (fVar258 * auVar70._8_4_ + fVar231 * auVar124._8_4_);
          fVar195 = fVar195 - (fVar258 * auVar70._12_4_ + fVar231 * auVar124._12_4_);
          auVar319._0_8_ = CONCAT44(fVar244 * fVar316,fVar244 * fVar170);
          auVar319._8_4_ = fVar244 * fVar259;
          auVar319._12_4_ = fVar244 * fVar167;
          auVar241._0_4_ = fVar244 * fVar309;
          auVar241._4_4_ = fVar244 * fVar169;
          auVar241._8_4_ = fVar244 * fVar290;
          auVar241._12_4_ = fVar244 * fVar168;
          auVar325._8_4_ = auVar319._8_4_;
          auVar325._0_8_ = auVar319._0_8_;
          auVar325._12_4_ = auVar319._12_4_;
          auVar126 = minps(auVar325,auVar241);
          auVar124 = maxps(auVar241,auVar319);
          auVar153._0_8_ = CONCAT44(fVar292 * fVar167,fVar292 * fVar259);
          auVar153._8_4_ = fVar292 * fVar261;
          auVar153._12_4_ = fVar292 * fVar262;
          auVar320._0_4_ = fVar292 * fVar290;
          auVar320._4_4_ = fVar292 * fVar168;
          auVar320._8_4_ = fVar292 * fVar161;
          auVar320._12_4_ = fVar292 * fVar99;
          auVar225._8_4_ = auVar153._8_4_;
          auVar225._0_8_ = auVar153._0_8_;
          auVar225._12_4_ = auVar153._12_4_;
          auVar70 = minps(auVar225,auVar320);
          auVar236 = maxps(auVar320,auVar153);
          fVar231 = 0.0 - (auVar236._0_4_ + auVar124._0_4_);
          fVar258 = 1.0 - (auVar236._4_4_ + auVar124._4_4_);
          fVar305 = 0.0 - (auVar236._8_4_ + auVar124._8_4_);
          fVar287 = 0.0 - (auVar236._12_4_ + auVar124._12_4_);
          fVar313 = 0.0 - (auVar70._0_4_ + auVar126._0_4_);
          fVar293 = 1.0 - (auVar70._4_4_ + auVar126._4_4_);
          fVar315 = 0.0 - (auVar70._8_4_ + auVar126._8_4_);
          fVar165 = 0.0 - (auVar70._12_4_ + auVar126._12_4_);
          auVar242._0_8_ = CONCAT44(fVar288 * fVar258,fVar277 * fVar231);
          auVar242._8_4_ = fVar291 * fVar305;
          auVar242._12_4_ = fVar294 * fVar287;
          auVar284._0_8_ = CONCAT44(fVar316 * fVar303,fVar170 * fVar303);
          auVar284._8_4_ = fVar259 * fVar303;
          auVar284._12_4_ = fVar167 * fVar303;
          auVar226._0_4_ = fVar303 * fVar309;
          auVar226._4_4_ = fVar303 * fVar169;
          auVar226._8_4_ = fVar303 * fVar290;
          auVar226._12_4_ = fVar303 * fVar168;
          auVar301._8_4_ = auVar284._8_4_;
          auVar301._0_8_ = auVar284._0_8_;
          auVar301._12_4_ = auVar284._12_4_;
          auVar124 = minps(auVar301,auVar226);
          auVar70 = maxps(auVar226,auVar284);
          auVar202._0_8_ = CONCAT44(fVar167 * fVar295,fVar259 * fVar295);
          auVar202._8_4_ = fVar261 * fVar295;
          auVar202._12_4_ = fVar262 * fVar295;
          auVar321._0_4_ = fVar295 * fVar290;
          auVar321._4_4_ = fVar295 * fVar168;
          auVar321._8_4_ = fVar295 * fVar161;
          auVar321._12_4_ = fVar295 * fVar99;
          auVar326._8_4_ = auVar202._8_4_;
          auVar326._0_8_ = auVar202._0_8_;
          auVar326._12_4_ = auVar202._12_4_;
          auVar126 = minps(auVar326,auVar321);
          auVar285._0_4_ = fVar277 * fVar313;
          auVar285._4_4_ = fVar288 * fVar293;
          auVar285._8_4_ = fVar291 * fVar315;
          auVar285._12_4_ = fVar294 * fVar165;
          auVar154._0_8_ = CONCAT44(fVar258 * fVar299,fVar231 * fVar297);
          auVar154._8_4_ = fVar305 * fVar141;
          auVar154._12_4_ = fVar287 * fVar100;
          auVar163._0_4_ = fVar313 * fVar297;
          auVar163._4_4_ = fVar293 * fVar299;
          auVar163._8_4_ = fVar315 * fVar141;
          auVar163._12_4_ = fVar165 * fVar100;
          auVar236 = maxps(auVar321,auVar202);
          fVar99 = 1.0 - (auVar236._0_4_ + auVar70._0_4_);
          fVar231 = 0.0 - (auVar236._4_4_ + auVar70._4_4_);
          fVar258 = 0.0 - (auVar236._8_4_ + auVar70._8_4_);
          fVar305 = 0.0 - (auVar236._12_4_ + auVar70._12_4_);
          fVar287 = 1.0 - (auVar126._0_4_ + auVar124._0_4_);
          fVar309 = 0.0 - (auVar126._4_4_ + auVar124._4_4_);
          fVar313 = 0.0 - (auVar126._8_4_ + auVar124._8_4_);
          fVar290 = 0.0 - (auVar126._12_4_ + auVar124._12_4_);
          auVar227._0_8_ = CONCAT44(fVar288 * fVar231,fVar277 * fVar99);
          auVar227._8_4_ = fVar291 * fVar258;
          auVar227._12_4_ = fVar294 * fVar305;
          auVar257._0_4_ = fVar277 * fVar287;
          auVar257._4_4_ = fVar288 * fVar309;
          auVar257._8_4_ = fVar291 * fVar313;
          auVar257._12_4_ = fVar294 * fVar290;
          auVar203._0_8_ = CONCAT44(fVar231 * fVar299,fVar99 * fVar297);
          auVar203._8_4_ = fVar258 * fVar141;
          auVar203._12_4_ = fVar305 * fVar100;
          auVar216._0_4_ = fVar287 * fVar297;
          auVar216._4_4_ = fVar309 * fVar299;
          auVar216._8_4_ = fVar313 * fVar141;
          auVar216._12_4_ = fVar290 * fVar100;
          auVar271._8_4_ = auVar227._8_4_;
          auVar271._0_8_ = auVar227._0_8_;
          auVar271._12_4_ = auVar227._12_4_;
          auVar70 = minps(auVar271,auVar257);
          auVar302._8_4_ = auVar203._8_4_;
          auVar302._0_8_ = auVar203._0_8_;
          auVar302._12_4_ = auVar203._12_4_;
          auVar124 = minps(auVar302,auVar216);
          auVar126 = minps(auVar70,auVar124);
          auVar124 = maxps(auVar257,auVar227);
          auVar70 = maxps(auVar216,auVar203);
          auVar236 = maxps(auVar70,auVar124);
          auVar204._8_4_ = auVar242._8_4_;
          auVar204._0_8_ = auVar242._0_8_;
          auVar204._12_4_ = auVar242._12_4_;
          auVar70 = minps(auVar204,auVar285);
          auVar228._8_4_ = auVar154._8_4_;
          auVar228._0_8_ = auVar154._0_8_;
          auVar228._12_4_ = auVar154._12_4_;
          auVar124 = minps(auVar228,auVar163);
          auVar124 = minps(auVar70,auVar124);
          auVar318 = maxps(auVar285,auVar242);
          auVar70 = maxps(auVar163,auVar154);
          auVar70 = maxps(auVar70,auVar318);
          auVar205._0_4_ = auVar126._4_4_ + auVar126._0_4_ + fVar194;
          auVar205._4_4_ = auVar124._4_4_ + auVar124._0_4_ + fVar206;
          auVar205._8_4_ = auVar126._8_4_ + auVar126._4_4_ + fVar208;
          auVar205._12_4_ = auVar126._12_4_ + auVar124._4_4_ + fVar195;
          fVar99 = auVar236._4_4_ + auVar236._0_4_ + fVar194;
          fVar100 = auVar70._4_4_ + auVar70._0_4_ + fVar206;
          auVar155._4_4_ = fVar100;
          auVar155._0_4_ = fVar99;
          auVar27._4_4_ = fVar304;
          auVar27._0_4_ = fVar101;
          auVar27._8_4_ = fVar120;
          auVar27._12_4_ = fStack_53c;
          auVar124 = maxps(auVar27,auVar205);
          auVar155._8_4_ = auVar236._8_4_ + auVar236._4_4_ + fVar208;
          auVar155._12_4_ = auVar236._12_4_ + auVar70._4_4_ + fVar195;
          auVar70 = minps(auVar155,auVar193);
          iVar57 = -(uint)(auVar70._0_4_ < auVar124._0_4_);
          iVar65 = -(uint)(auVar70._4_4_ < auVar124._4_4_);
          auVar157._4_4_ = iVar65;
          auVar157._0_4_ = iVar57;
          auVar157._8_4_ = iVar65;
          auVar157._12_4_ = iVar65;
          auVar156._8_8_ = auVar157._8_8_;
          auVar156._4_4_ = iVar57;
          auVar156._0_4_ = iVar57;
          uVar66 = movmskpd((int)uVar58,auVar156);
          uVar58 = (ulong)uVar66;
          fStack_540 = fVar120;
          if (uVar66 == 0) {
            uVar58 = 0;
            if (auVar205._0_4_ <= fVar101) {
              auVar327._4_4_ = fVar207;
              auVar327._0_4_ = fVar196;
              auVar327._8_4_ = fVar260;
              auVar327._12_4_ = fVar263;
            }
            else {
              auVar327._4_4_ = fVar207;
              auVar327._0_4_ = fVar196;
              auVar327._8_4_ = fVar260;
              auVar327._12_4_ = fVar263;
              if (fVar99 < fVar120) {
                iVar57 = -(uint)(fVar100 < fStack_53c);
                uVar58 = (ulong)CONCAT11((char)((uint)iVar57 >> 8),
                                         (byte)iVar57 & fVar304 < auVar205._4_4_);
              }
            }
            bVar50 = bVar62 | (byte)uVar58;
            uVar53 = (ulong)CONCAT31(uVar22,bVar50);
            if (bVar50 == 1) {
              uVar53 = 200;
              do {
                fVar100 = 1.0 - fVar194;
                fVar141 = fVar194 * fVar194 * fVar194;
                fVar120 = fVar194 * fVar194 * 3.0 * fVar100;
                fVar99 = fVar100 * fVar100 * fVar100;
                fVar195 = fVar194 * 3.0 * fVar100 * fVar100;
                fVar100 = fVar99 * auVar327._0_4_ +
                          fVar195 * fVar217 + fVar120 * fVar247 + fVar141 * (float)local_148._0_4_;
                fVar101 = fVar99 * auVar327._4_4_ +
                          fVar195 * fVar218 + fVar120 * fVar276 + fVar141 * (float)local_148._4_4_;
                fVar100 = ((fVar99 * auVar327._8_4_ +
                           fVar195 * fVar272 + fVar120 * fVar274 + fVar141 * fStack_140) - fVar100)
                          * fVar206 + fVar100;
                fVar101 = ((fVar99 * auVar327._12_4_ +
                           fVar195 * fVar273 + fVar120 * fVar286 + fVar141 * fStack_13c) - fVar101)
                          * fVar206 + fVar101;
                fVar194 = fVar194 - (fVar101 * fVar295 + fVar100 * fVar303);
                fVar206 = fVar206 - (fVar101 * fVar292 + fVar100 * fVar244);
                fVar99 = ABS(fVar101);
                if (ABS(fVar101) <= ABS(fVar100)) {
                  fVar99 = ABS(fVar100);
                }
                if (fVar99 < fVar140) {
                  if ((((0.0 <= fVar194) && (fVar194 <= 1.0)) && (0.0 <= fVar206)) &&
                     (fVar206 <= 1.0)) {
                    fVar99 = pre->ray_space[k].vx.field_0.m128[2];
                    fVar100 = pre->ray_space[k].vy.field_0.m128[2];
                    fVar101 = pre->ray_space[k].vz.field_0.m128[2];
                    fVar295 = 1.0 - fVar206;
                    fVar231 = 1.0 - fVar194;
                    fVar120 = fVar231 * fVar231 * fVar231;
                    fVar141 = fVar194 * 3.0 * fVar231 * fVar231;
                    fVar208 = fVar194 * fVar194 * fVar194;
                    fVar195 = fVar194 * fVar194 * 3.0 * fVar231;
                    fVar99 = ((fStack_150 * fVar101 + fStack_154 * fVar100 + local_158 * fVar99) *
                              fVar295 +
                             (fStack_190 * fVar101 + fStack_194 * fVar100 + local_198 * fVar99) *
                             fVar206) * fVar120 +
                             ((fStack_160 * fVar101 + fStack_164 * fVar100 + local_168 * fVar99) *
                              fVar295 +
                             (fStack_1a0 * fVar101 + fStack_1a4 * fVar100 + local_1a8 * fVar99) *
                             fVar206) * fVar141 +
                             ((fStack_170 * fVar101 + fStack_174 * fVar100 + local_178 * fVar99) *
                              fVar295 +
                             (fStack_1b0 * fVar101 + fStack_1b4 * fVar100 + local_1b8 * fVar99) *
                             fVar206) * fVar195 +
                             (fVar295 * (fStack_180 * fVar101 +
                                        fStack_184 * fVar100 + local_188 * fVar99) +
                             (fVar101 * fStack_1c0 + fVar100 * fStack_1c4 + fVar99 * local_1c8) *
                             fVar206) * fVar208;
                    if ((fVar69 <= fVar99) &&
                       (fVar100 = *(float *)(ray + k * 4 + 0x80), fVar99 <= fVar100)) {
                      fVar292 = 1.0 - fVar206;
                      fVar303 = 1.0 - fVar206;
                      fVar244 = 1.0 - fVar206;
                      fVar101 = fVar311 * fVar292 + fVar243 * fVar206;
                      fVar295 = fVar246 * fVar303 + fVar245 * fVar206;
                      fVar258 = fVar298 * fVar244 + fVar275 * fVar206;
                      fVar247 = fVar229 * fVar292 + fVar121 * fVar206;
                      fVar305 = fVar230 * fVar303 + fVar122 * fVar206;
                      fVar309 = fVar248 * fVar244 + fVar139 * fVar206;
                      fVar276 = fVar247 - fVar101;
                      fVar287 = fVar305 - fVar295;
                      fVar313 = fVar309 - fVar258;
                      fVar101 = (((fVar101 - (fVar296 * fVar292 + fVar159 * fVar206)) * fVar231 +
                                 fVar194 * fVar276) * fVar231 +
                                (fVar276 * fVar231 +
                                ((fVar292 * fVar158 + local_288 * fVar206) - fVar247) * fVar194) *
                                fVar194) * 3.0;
                      fVar295 = (((fVar295 - (fVar307 * fVar303 + fVar164 * fVar206)) * fVar231 +
                                 fVar194 * fVar287) * fVar231 +
                                (fVar287 * fVar231 +
                                ((fVar303 * fVar160 + fStack_284 * fVar206) - fVar305) * fVar194) *
                                fVar194) * 3.0;
                      fVar231 = (((fVar258 - (fVar249 * fVar244 + fVar171 * fVar206)) * fVar231 +
                                 fVar194 * fVar313) * fVar231 +
                                (fVar313 * fVar231 +
                                ((fVar244 * fVar166 + fStack_280 * fVar206) - fVar309) * fVar194) *
                                fVar194) * 3.0;
                      pGVar12 = (context->scene->geometries).items[uVar64].ptr;
                      if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                        uVar53 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar53 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar258 = fVar120 * local_2a8 +
                                  fVar141 * local_2b8 + fVar195 * local_2c8 + fVar208 * local_2d8;
                        fVar292 = fVar120 * fStack_2a4 +
                                  fVar141 * fStack_2b4 + fVar195 * fStack_2c4 + fVar208 * fStack_2d4
                        ;
                        fVar120 = fVar120 * fStack_2a0 +
                                  fVar141 * fStack_2b0 + fVar195 * fStack_2c0 + fVar208 * fStack_2d0
                        ;
                        local_c8 = fVar292 * fVar101 - fVar295 * fVar258;
                        local_e8 = fVar120 * fVar295 - fVar231 * fVar292;
                        local_d8 = fVar258 * fVar231 - fVar101 * fVar120;
                        fStack_e4 = local_e8;
                        fStack_e0 = local_e8;
                        fStack_dc = local_e8;
                        fStack_d4 = local_d8;
                        fStack_d0 = local_d8;
                        fStack_cc = local_d8;
                        fStack_c4 = local_c8;
                        fStack_c0 = local_c8;
                        fStack_bc = local_c8;
                        local_b8 = fVar194;
                        fStack_b4 = fVar194;
                        fStack_b0 = fVar194;
                        fStack_ac = fVar194;
                        local_a8 = fVar206;
                        fStack_a4 = fVar206;
                        fStack_a0 = fVar206;
                        fStack_9c = fVar206;
                        local_98 = CONCAT44(uStack_2f4,local_2f8);
                        uStack_90 = CONCAT44(uStack_2ec,uStack_2f0);
                        local_88 = CONCAT44(uStack_2e4,local_2e8);
                        uStack_80 = CONCAT44(uStack_2dc,uStack_2e0);
                        local_78 = context->user->instID[0];
                        uStack_74 = local_78;
                        uStack_70 = local_78;
                        uStack_6c = local_78;
                        local_68 = context->user->instPrimID[0];
                        uStack_64 = local_68;
                        uStack_60 = local_68;
                        uStack_5c = local_68;
                        *(float *)(ray + k * 4 + 0x80) = fVar99;
                        local_408 = *local_3f0;
                        uStack_400 = local_3f0[1];
                        local_328.valid = (int *)&local_408;
                        local_328.geometryUserPtr = pGVar12->userPtr;
                        local_328.context = context->user;
                        local_328.ray = (RTCRayN *)ray;
                        local_328.hit = (RTCHitN *)&local_e8;
                        local_328.N = 4;
                        p_Var55 = pGVar12->occlusionFilterN;
                        if (p_Var55 != (RTCFilterFunctionN)0x0) {
                          p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_328);
                        }
                        auVar95._0_4_ = -(uint)((int)local_408 == 0);
                        auVar95._4_4_ = -(uint)(local_408._4_4_ == 0);
                        auVar95._8_4_ = -(uint)((int)uStack_400 == 0);
                        auVar95._12_4_ = -(uint)(uStack_400._4_4_ == 0);
                        uVar66 = movmskps((int)p_Var55,auVar95);
                        pRVar56 = (RTCRayN *)(ulong)(uVar66 ^ 0xf);
                        if ((uVar66 ^ 0xf) == 0) {
                          auVar95 = auVar95 ^ _DAT_01febe20;
                        }
                        else {
                          p_Var55 = context->args->filter;
                          if ((p_Var55 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var55)(&local_328);
                          }
                          auVar118._0_4_ = -(uint)((int)local_408 == 0);
                          auVar118._4_4_ = -(uint)(local_408._4_4_ == 0);
                          auVar118._8_4_ = -(uint)((int)uStack_400 == 0);
                          auVar118._12_4_ = -(uint)(uStack_400._4_4_ == 0);
                          auVar95 = auVar118 ^ _DAT_01febe20;
                          *(undefined1 (*) [16])(local_328.ray + 0x80) =
                               ~auVar118 & _DAT_01feba00 |
                               *(undefined1 (*) [16])(local_328.ray + 0x80) & auVar118;
                          pRVar56 = local_328.ray;
                        }
                        auVar96._0_4_ = auVar95._0_4_ << 0x1f;
                        auVar96._4_4_ = auVar95._4_4_ << 0x1f;
                        auVar96._8_4_ = auVar95._8_4_ << 0x1f;
                        auVar96._12_4_ = auVar95._12_4_ << 0x1f;
                        iVar57 = movmskps((int)pRVar56,auVar96);
                        if (iVar57 == 0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar100;
                        }
                        uVar53 = (ulong)CONCAT31((int3)((uint)iVar57 >> 8),(char)iVar57 != '\0');
                      }
                      local_54c = (uint)(byte)((byte)local_54c | (byte)uVar53);
                      uVar58 = (ulong)local_54c;
                    }
                  }
                  break;
                }
                uVar53 = uVar53 - 1;
              } while (uVar53 != 0);
            }
            else {
              bVar25 = false;
            }
          }
        }
      }
    } while (bVar25);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }